

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  ulong uVar62;
  byte bVar63;
  uint uVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar103 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar104 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float t1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar188;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar209;
  float fVar210;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar204 [32];
  float fVar211;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar215;
  float fVar227;
  float fVar228;
  vfloat4 b0;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar223 [32];
  float fVar229;
  undefined1 auVar224 [32];
  undefined1 auVar231 [16];
  undefined1 auVar226 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  float fVar259;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  undefined1 auVar257 [32];
  float fVar261;
  undefined1 auVar258 [64];
  float fVar262;
  float fVar271;
  float fVar272;
  __m128 a;
  undefined1 auVar263 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar264 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar273;
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  vfloat4 a0;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar280 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  vfloat4 a0_1;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar298;
  float fVar306;
  undefined1 auVar301 [16];
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  float in_register_0000151c;
  undefined1 auVar302 [32];
  float fVar310;
  undefined1 auVar303 [64];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  float fVar316;
  undefined1 auVar315 [64];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float in_register_0000159c;
  undefined1 auVar321 [32];
  float fVar327;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float in_register_000015dc;
  undefined1 auVar326 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 auStack_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float fStack_360;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float fStack_340;
  RTCFilterFunctionNArguments local_338;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 auStack_2c8 [16];
  uint auStack_2b8 [4];
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_29c;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar225 [32];
  undefined1 auVar322 [32];
  
  PVar6 = prim[1];
  uVar67 = (ulong)(byte)PVar6;
  lVar65 = uVar67 * 5;
  fVar192 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar193._0_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar193._4_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar193._8_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar193._12_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 10)));
  auVar99._0_4_ = fVar192 * auVar20._0_4_;
  auVar99._4_4_ = fVar192 * auVar20._4_4_;
  auVar99._8_4_ = fVar192 * auVar20._8_4_;
  auVar99._12_4_ = fVar192 * auVar20._12_4_;
  auVar89._16_16_ = auVar77;
  auVar89._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar65 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar65 + 10)));
  auVar152._16_16_ = auVar77;
  auVar152._0_16_ = auVar150;
  auVar12 = vcvtdq2ps_avx(auVar152);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 10)));
  auVar163._16_16_ = auVar77;
  auVar163._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 10)));
  auVar13 = vcvtdq2ps_avx(auVar163);
  auVar164._16_16_ = auVar77;
  auVar164._0_16_ = auVar150;
  auVar14 = vcvtdq2ps_avx(auVar164);
  uVar66 = (ulong)((uint)(byte)PVar6 * 0xc);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 10)));
  auVar223._16_16_ = auVar77;
  auVar223._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar67 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar223);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar67 + 10)));
  auVar240._16_16_ = auVar77;
  auVar240._0_16_ = auVar150;
  lVar11 = uVar67 * 9;
  uVar66 = (ulong)(uint)((int)lVar11 * 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar240);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 10)));
  auVar241._16_16_ = auVar77;
  auVar241._0_16_ = auVar150;
  auVar17 = vcvtdq2ps_avx(auVar241);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar67 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar67 + 10)));
  auVar267._16_16_ = auVar77;
  auVar267._0_16_ = auVar150;
  uVar66 = (ulong)(uint)((int)lVar65 << 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 10)));
  auVar18 = vcvtdq2ps_avx(auVar267);
  auVar285._16_16_ = auVar77;
  auVar285._0_16_ = auVar150;
  auVar19 = vcvtdq2ps_avx(auVar285);
  auVar150 = vshufps_avx(auVar193,auVar193,0);
  auVar77 = vshufps_avx(auVar193,auVar193,0x55);
  auVar20 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar192 = auVar20._0_4_;
  fVar215 = auVar20._4_4_;
  fVar209 = auVar20._8_4_;
  fVar227 = auVar20._12_4_;
  fVar210 = auVar77._0_4_;
  fVar228 = auVar77._4_4_;
  fVar211 = auVar77._8_4_;
  fVar229 = auVar77._12_4_;
  fVar212 = auVar150._0_4_;
  fVar230 = auVar150._4_4_;
  fVar213 = auVar150._8_4_;
  fVar232 = auVar150._12_4_;
  auVar302._0_4_ = fVar212 * auVar89._0_4_ + fVar210 * auVar12._0_4_ + fVar192 * auVar13._0_4_;
  auVar302._4_4_ = fVar230 * auVar89._4_4_ + fVar228 * auVar12._4_4_ + fVar215 * auVar13._4_4_;
  auVar302._8_4_ = fVar213 * auVar89._8_4_ + fVar211 * auVar12._8_4_ + fVar209 * auVar13._8_4_;
  auVar302._12_4_ = fVar232 * auVar89._12_4_ + fVar229 * auVar12._12_4_ + fVar227 * auVar13._12_4_;
  auVar302._16_4_ = fVar212 * auVar89._16_4_ + fVar210 * auVar12._16_4_ + fVar192 * auVar13._16_4_;
  auVar302._20_4_ = fVar230 * auVar89._20_4_ + fVar228 * auVar12._20_4_ + fVar215 * auVar13._20_4_;
  auVar302._24_4_ = fVar213 * auVar89._24_4_ + fVar211 * auVar12._24_4_ + fVar209 * auVar13._24_4_;
  auVar302._28_4_ = fVar229 + in_register_000015dc + in_register_0000151c;
  auVar294._0_4_ = fVar212 * auVar14._0_4_ + fVar210 * auVar15._0_4_ + auVar16._0_4_ * fVar192;
  auVar294._4_4_ = fVar230 * auVar14._4_4_ + fVar228 * auVar15._4_4_ + auVar16._4_4_ * fVar215;
  auVar294._8_4_ = fVar213 * auVar14._8_4_ + fVar211 * auVar15._8_4_ + auVar16._8_4_ * fVar209;
  auVar294._12_4_ = fVar232 * auVar14._12_4_ + fVar229 * auVar15._12_4_ + auVar16._12_4_ * fVar227;
  auVar294._16_4_ = fVar212 * auVar14._16_4_ + fVar210 * auVar15._16_4_ + auVar16._16_4_ * fVar192;
  auVar294._20_4_ = fVar230 * auVar14._20_4_ + fVar228 * auVar15._20_4_ + auVar16._20_4_ * fVar215;
  auVar294._24_4_ = fVar213 * auVar14._24_4_ + fVar211 * auVar15._24_4_ + auVar16._24_4_ * fVar209;
  auVar294._28_4_ = fVar229 + in_register_000015dc + in_register_0000159c;
  auVar204._0_4_ = fVar212 * auVar17._0_4_ + fVar210 * auVar18._0_4_ + auVar19._0_4_ * fVar192;
  auVar204._4_4_ = fVar230 * auVar17._4_4_ + fVar228 * auVar18._4_4_ + auVar19._4_4_ * fVar215;
  auVar204._8_4_ = fVar213 * auVar17._8_4_ + fVar211 * auVar18._8_4_ + auVar19._8_4_ * fVar209;
  auVar204._12_4_ = fVar232 * auVar17._12_4_ + fVar229 * auVar18._12_4_ + auVar19._12_4_ * fVar227;
  auVar204._16_4_ = fVar212 * auVar17._16_4_ + fVar210 * auVar18._16_4_ + auVar19._16_4_ * fVar192;
  auVar204._20_4_ = fVar230 * auVar17._20_4_ + fVar228 * auVar18._20_4_ + auVar19._20_4_ * fVar215;
  auVar204._24_4_ = fVar213 * auVar17._24_4_ + fVar211 * auVar18._24_4_ + auVar19._24_4_ * fVar209;
  auVar204._28_4_ = fVar232 + fVar229 + fVar227;
  auVar150 = vshufps_avx(auVar99,auVar99,0);
  auVar77 = vshufps_avx(auVar99,auVar99,0x55);
  auVar20 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar215 = auVar20._0_4_;
  fVar209 = auVar20._4_4_;
  fVar227 = auVar20._8_4_;
  fVar210 = auVar20._12_4_;
  fVar230 = auVar77._0_4_;
  fVar213 = auVar77._4_4_;
  fVar232 = auVar77._8_4_;
  fVar214 = auVar77._12_4_;
  fVar228 = auVar150._0_4_;
  fVar211 = auVar150._4_4_;
  fVar229 = auVar150._8_4_;
  fVar212 = auVar150._12_4_;
  fVar192 = auVar89._28_4_;
  auVar124._0_4_ = fVar228 * auVar89._0_4_ + fVar230 * auVar12._0_4_ + fVar215 * auVar13._0_4_;
  auVar124._4_4_ = fVar211 * auVar89._4_4_ + fVar213 * auVar12._4_4_ + fVar209 * auVar13._4_4_;
  auVar124._8_4_ = fVar229 * auVar89._8_4_ + fVar232 * auVar12._8_4_ + fVar227 * auVar13._8_4_;
  auVar124._12_4_ = fVar212 * auVar89._12_4_ + fVar214 * auVar12._12_4_ + fVar210 * auVar13._12_4_;
  auVar124._16_4_ = fVar228 * auVar89._16_4_ + fVar230 * auVar12._16_4_ + fVar215 * auVar13._16_4_;
  auVar124._20_4_ = fVar211 * auVar89._20_4_ + fVar213 * auVar12._20_4_ + fVar209 * auVar13._20_4_;
  auVar124._24_4_ = fVar229 * auVar89._24_4_ + fVar232 * auVar12._24_4_ + fVar227 * auVar13._24_4_;
  auVar124._28_4_ = fVar192 + auVar12._28_4_ + auVar13._28_4_;
  auVar153._0_4_ = fVar228 * auVar14._0_4_ + auVar16._0_4_ * fVar215 + fVar230 * auVar15._0_4_;
  auVar153._4_4_ = fVar211 * auVar14._4_4_ + auVar16._4_4_ * fVar209 + fVar213 * auVar15._4_4_;
  auVar153._8_4_ = fVar229 * auVar14._8_4_ + auVar16._8_4_ * fVar227 + fVar232 * auVar15._8_4_;
  auVar153._12_4_ = fVar212 * auVar14._12_4_ + auVar16._12_4_ * fVar210 + fVar214 * auVar15._12_4_;
  auVar153._16_4_ = fVar228 * auVar14._16_4_ + auVar16._16_4_ * fVar215 + fVar230 * auVar15._16_4_;
  auVar153._20_4_ = fVar211 * auVar14._20_4_ + auVar16._20_4_ * fVar209 + fVar213 * auVar15._20_4_;
  auVar153._24_4_ = fVar229 * auVar14._24_4_ + auVar16._24_4_ * fVar227 + fVar232 * auVar15._24_4_;
  auVar153._28_4_ = fVar192 + auVar16._28_4_ + auVar13._28_4_;
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar165._16_4_ = 0x7fffffff;
  auVar165._20_4_ = 0x7fffffff;
  auVar165._24_4_ = 0x7fffffff;
  auVar165._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar89 = vandps_avx(auVar302,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar12 = vblendvps_avx(auVar302,auVar183,auVar89);
  auVar89 = vandps_avx(auVar294,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar13 = vblendvps_avx(auVar294,auVar183,auVar89);
  auVar89 = vandps_avx(auVar204,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar89 = vblendvps_avx(auVar204,auVar183,auVar89);
  auVar166._0_4_ = fVar228 * auVar17._0_4_ + fVar230 * auVar18._0_4_ + auVar19._0_4_ * fVar215;
  auVar166._4_4_ = fVar211 * auVar17._4_4_ + fVar213 * auVar18._4_4_ + auVar19._4_4_ * fVar209;
  auVar166._8_4_ = fVar229 * auVar17._8_4_ + fVar232 * auVar18._8_4_ + auVar19._8_4_ * fVar227;
  auVar166._12_4_ = fVar212 * auVar17._12_4_ + fVar214 * auVar18._12_4_ + auVar19._12_4_ * fVar210;
  auVar166._16_4_ = fVar228 * auVar17._16_4_ + fVar230 * auVar18._16_4_ + auVar19._16_4_ * fVar215;
  auVar166._20_4_ = fVar211 * auVar17._20_4_ + fVar213 * auVar18._20_4_ + auVar19._20_4_ * fVar209;
  auVar166._24_4_ = fVar229 * auVar17._24_4_ + fVar232 * auVar18._24_4_ + auVar19._24_4_ * fVar227;
  auVar166._28_4_ = fVar192 + auVar15._28_4_ + fVar210;
  auVar14 = vrcpps_avx(auVar12);
  fVar192 = auVar14._0_4_;
  fVar209 = auVar14._4_4_;
  auVar15._4_4_ = auVar12._4_4_ * fVar209;
  auVar15._0_4_ = auVar12._0_4_ * fVar192;
  fVar210 = auVar14._8_4_;
  auVar15._8_4_ = auVar12._8_4_ * fVar210;
  fVar211 = auVar14._12_4_;
  auVar15._12_4_ = auVar12._12_4_ * fVar211;
  fVar212 = auVar14._16_4_;
  auVar15._16_4_ = auVar12._16_4_ * fVar212;
  fVar213 = auVar14._20_4_;
  auVar15._20_4_ = auVar12._20_4_ * fVar213;
  fVar214 = auVar14._24_4_;
  auVar15._24_4_ = auVar12._24_4_ * fVar214;
  auVar15._28_4_ = auVar204._28_4_;
  auVar242._8_4_ = 0x3f800000;
  auVar242._0_8_ = 0x3f8000003f800000;
  auVar242._12_4_ = 0x3f800000;
  auVar242._16_4_ = 0x3f800000;
  auVar242._20_4_ = 0x3f800000;
  auVar242._24_4_ = 0x3f800000;
  auVar242._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar242,auVar15);
  auVar12 = vrcpps_avx(auVar13);
  fVar192 = fVar192 + fVar192 * auVar15._0_4_;
  fVar209 = fVar209 + fVar209 * auVar15._4_4_;
  fVar210 = fVar210 + fVar210 * auVar15._8_4_;
  fVar211 = fVar211 + fVar211 * auVar15._12_4_;
  fVar212 = fVar212 + fVar212 * auVar15._16_4_;
  fVar213 = fVar213 + fVar213 * auVar15._20_4_;
  fVar214 = fVar214 + fVar214 * auVar15._24_4_;
  fVar215 = auVar12._0_4_;
  fVar227 = auVar12._4_4_;
  auVar16._4_4_ = auVar13._4_4_ * fVar227;
  auVar16._0_4_ = auVar13._0_4_ * fVar215;
  fVar228 = auVar12._8_4_;
  auVar16._8_4_ = auVar13._8_4_ * fVar228;
  fVar229 = auVar12._12_4_;
  auVar16._12_4_ = auVar13._12_4_ * fVar229;
  fVar230 = auVar12._16_4_;
  auVar16._16_4_ = auVar13._16_4_ * fVar230;
  fVar232 = auVar12._20_4_;
  auVar16._20_4_ = auVar13._20_4_ * fVar232;
  fVar233 = auVar12._24_4_;
  auVar16._24_4_ = auVar13._24_4_ * fVar233;
  auVar16._28_4_ = auVar14._28_4_;
  auVar12 = vsubps_avx(auVar242,auVar16);
  fVar215 = fVar215 + fVar215 * auVar12._0_4_;
  fVar227 = fVar227 + fVar227 * auVar12._4_4_;
  fVar228 = fVar228 + fVar228 * auVar12._8_4_;
  fVar229 = fVar229 + fVar229 * auVar12._12_4_;
  fVar230 = fVar230 + fVar230 * auVar12._16_4_;
  fVar232 = fVar232 + fVar232 * auVar12._20_4_;
  fVar233 = fVar233 + fVar233 * auVar12._24_4_;
  auVar12 = vrcpps_avx(auVar89);
  fVar168 = auVar12._0_4_;
  fVar186 = auVar12._4_4_;
  auVar13._4_4_ = fVar186 * auVar89._4_4_;
  auVar13._0_4_ = fVar168 * auVar89._0_4_;
  fVar187 = auVar12._8_4_;
  auVar13._8_4_ = fVar187 * auVar89._8_4_;
  fVar188 = auVar12._12_4_;
  auVar13._12_4_ = fVar188 * auVar89._12_4_;
  fVar189 = auVar12._16_4_;
  auVar13._16_4_ = fVar189 * auVar89._16_4_;
  fVar190 = auVar12._20_4_;
  auVar13._20_4_ = fVar190 * auVar89._20_4_;
  fVar191 = auVar12._24_4_;
  auVar13._24_4_ = fVar191 * auVar89._24_4_;
  auVar13._28_4_ = auVar89._28_4_;
  auVar89 = vsubps_avx(auVar242,auVar13);
  fVar168 = fVar168 + fVar168 * auVar89._0_4_;
  fVar186 = fVar186 + fVar186 * auVar89._4_4_;
  fVar187 = fVar187 + fVar187 * auVar89._8_4_;
  fVar188 = fVar188 + fVar188 * auVar89._12_4_;
  fVar189 = fVar189 + fVar189 * auVar89._16_4_;
  fVar190 = fVar190 + fVar190 * auVar89._20_4_;
  fVar191 = fVar191 + fVar191 * auVar89._24_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 7 + 0xe);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar90._16_16_ = auVar77;
  auVar90._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar90);
  auVar89 = vsubps_avx(auVar89,auVar124);
  auVar69._0_4_ = fVar192 * auVar89._0_4_;
  auVar69._4_4_ = fVar209 * auVar89._4_4_;
  auVar69._8_4_ = fVar210 * auVar89._8_4_;
  auVar69._12_4_ = fVar211 * auVar89._12_4_;
  auVar14._16_4_ = fVar212 * auVar89._16_4_;
  auVar14._0_16_ = auVar69;
  auVar14._20_4_ = fVar213 * auVar89._20_4_;
  auVar14._24_4_ = fVar214 * auVar89._24_4_;
  auVar14._28_4_ = auVar89._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar11 + 6);
  auVar150 = vpmovsxwd_avx(auVar20);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + lVar11 + 0xe);
  auVar77 = vpmovsxwd_avx(auVar118);
  auVar243._16_16_ = auVar77;
  auVar243._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar243);
  auVar89 = vsubps_avx(auVar89,auVar124);
  auVar100._0_4_ = fVar192 * auVar89._0_4_;
  auVar100._4_4_ = fVar209 * auVar89._4_4_;
  auVar100._8_4_ = fVar210 * auVar89._8_4_;
  auVar100._12_4_ = fVar211 * auVar89._12_4_;
  auVar17._16_4_ = fVar212 * auVar89._16_4_;
  auVar17._0_16_ = auVar100;
  auVar17._20_4_ = fVar213 * auVar89._20_4_;
  auVar17._24_4_ = fVar214 * auVar89._24_4_;
  auVar17._28_4_ = auVar89._28_4_;
  lVar65 = (ulong)(byte)PVar6 * 0x10;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + lVar65 + 6);
  auVar150 = vpmovsxwd_avx(auVar86);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar65 + 0xe);
  auVar77 = vpmovsxwd_avx(auVar106);
  lVar65 = lVar65 + uVar67 * -2;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + lVar65 + 6);
  auVar20 = vpmovsxwd_avx(auVar136);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + lVar65 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar107);
  auVar205._16_16_ = auVar118;
  auVar205._0_16_ = auVar20;
  auVar89 = vcvtdq2ps_avx(auVar205);
  auVar89 = vsubps_avx(auVar89,auVar153);
  auVar194._0_4_ = fVar215 * auVar89._0_4_;
  auVar194._4_4_ = fVar227 * auVar89._4_4_;
  auVar194._8_4_ = fVar228 * auVar89._8_4_;
  auVar194._12_4_ = fVar229 * auVar89._12_4_;
  auVar18._16_4_ = fVar230 * auVar89._16_4_;
  auVar18._0_16_ = auVar194;
  auVar18._20_4_ = fVar232 * auVar89._20_4_;
  auVar18._24_4_ = fVar233 * auVar89._24_4_;
  auVar18._28_4_ = auVar89._28_4_;
  auVar244._16_16_ = auVar77;
  auVar244._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar244);
  auVar89 = vsubps_avx(auVar89,auVar153);
  auVar132._0_4_ = fVar215 * auVar89._0_4_;
  auVar132._4_4_ = fVar227 * auVar89._4_4_;
  auVar132._8_4_ = fVar228 * auVar89._8_4_;
  auVar132._12_4_ = fVar229 * auVar89._12_4_;
  auVar19._16_4_ = fVar230 * auVar89._16_4_;
  auVar19._0_16_ = auVar132;
  auVar19._20_4_ = fVar232 * auVar89._20_4_;
  auVar19._24_4_ = fVar233 * auVar89._24_4_;
  auVar19._28_4_ = auVar89._28_4_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar66 + uVar67 + 6);
  auVar150 = vpmovsxwd_avx(auVar231);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 + uVar67 + 0xe);
  auVar77 = vpmovsxwd_avx(auVar5);
  auVar224._16_16_ = auVar77;
  auVar224._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar224);
  auVar89 = vsubps_avx(auVar89,auVar166);
  auVar216._0_4_ = fVar168 * auVar89._0_4_;
  auVar216._4_4_ = fVar186 * auVar89._4_4_;
  auVar216._8_4_ = fVar187 * auVar89._8_4_;
  auVar216._12_4_ = fVar188 * auVar89._12_4_;
  auVar21._16_4_ = fVar189 * auVar89._16_4_;
  auVar21._0_16_ = auVar216;
  auVar21._20_4_ = fVar190 * auVar89._20_4_;
  auVar21._24_4_ = fVar191 * auVar89._24_4_;
  auVar21._28_4_ = auVar89._28_4_;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar150 = vpmovsxwd_avx(auVar252);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 0xe);
  auVar77 = vpmovsxwd_avx(auVar281);
  auVar245._16_16_ = auVar77;
  auVar245._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar245);
  auVar89 = vsubps_avx(auVar89,auVar166);
  auVar157._0_4_ = fVar168 * auVar89._0_4_;
  auVar157._4_4_ = fVar186 * auVar89._4_4_;
  auVar157._8_4_ = fVar187 * auVar89._8_4_;
  auVar157._12_4_ = fVar188 * auVar89._12_4_;
  auVar22._16_4_ = fVar189 * auVar89._16_4_;
  auVar22._0_16_ = auVar157;
  auVar22._20_4_ = fVar190 * auVar89._20_4_;
  auVar22._24_4_ = fVar191 * auVar89._24_4_;
  auVar22._28_4_ = auVar89._28_4_;
  auVar150 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
  auVar77 = vpminsd_avx(auVar69,auVar100);
  auVar286._16_16_ = auVar150;
  auVar286._0_16_ = auVar77;
  auVar150 = vpminsd_avx(auVar18._16_16_,auVar19._16_16_);
  auVar77 = vpminsd_avx(auVar194,auVar132);
  auVar295._16_16_ = auVar150;
  auVar295._0_16_ = auVar77;
  auVar89 = vmaxps_avx(auVar286,auVar295);
  auVar150 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar77 = vpminsd_avx(auVar216,auVar157);
  auVar314._16_16_ = auVar150;
  auVar314._0_16_ = auVar77;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar321._4_4_ = uVar2;
  auVar321._0_4_ = uVar2;
  auVar321._8_4_ = uVar2;
  auVar321._12_4_ = uVar2;
  auVar321._16_4_ = uVar2;
  auVar321._20_4_ = uVar2;
  auVar321._24_4_ = uVar2;
  auVar321._28_4_ = uVar2;
  auVar12 = vmaxps_avx(auVar314,auVar321);
  auVar89 = vmaxps_avx(auVar89,auVar12);
  local_198._4_4_ = auVar89._4_4_ * 0.99999964;
  local_198._0_4_ = auVar89._0_4_ * 0.99999964;
  local_198._8_4_ = auVar89._8_4_ * 0.99999964;
  local_198._12_4_ = auVar89._12_4_ * 0.99999964;
  local_198._16_4_ = auVar89._16_4_ * 0.99999964;
  local_198._20_4_ = auVar89._20_4_ * 0.99999964;
  local_198._24_4_ = auVar89._24_4_ * 0.99999964;
  local_198._28_4_ = auVar89._28_4_;
  auVar150 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
  auVar77 = vpmaxsd_avx(auVar69,auVar100);
  auVar91._16_16_ = auVar150;
  auVar91._0_16_ = auVar77;
  auVar150 = vpmaxsd_avx(auVar18._16_16_,auVar19._16_16_);
  auVar77 = vpmaxsd_avx(auVar194,auVar132);
  auVar125._16_16_ = auVar150;
  auVar125._0_16_ = auVar77;
  auVar89 = vminps_avx(auVar91,auVar125);
  auVar150 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar77 = vpmaxsd_avx(auVar216,auVar157);
  auVar126._16_16_ = auVar150;
  auVar126._0_16_ = auVar77;
  fVar192 = (ray->super_RayK<1>).tfar;
  auVar154._4_4_ = fVar192;
  auVar154._0_4_ = fVar192;
  auVar154._8_4_ = fVar192;
  auVar154._12_4_ = fVar192;
  auVar154._16_4_ = fVar192;
  auVar154._20_4_ = fVar192;
  auVar154._24_4_ = fVar192;
  auVar154._28_4_ = fVar192;
  auVar12 = vminps_avx(auVar126,auVar154);
  auVar89 = vminps_avx(auVar89,auVar12);
  auVar12._4_4_ = auVar89._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar89._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar89._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar89._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar89._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar89._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar89._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar89._28_4_;
  auVar89 = vcmpps_avx(local_198,auVar12,2);
  auVar150 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar127._16_16_ = auVar150;
  auVar127._0_16_ = auVar150;
  auVar12 = vcvtdq2ps_avx(auVar127);
  auVar12 = vcmpps_avx(_DAT_01faff40,auVar12,1);
  auVar89 = vandps_avx(auVar89,auVar12);
  uVar61 = vmovmskps_avx(auVar89);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  do {
    uVar67 = (ulong)uVar61;
    lVar65 = 0;
    if (uVar67 != 0) {
      for (; (uVar61 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
      }
    }
    uVar61 = *(uint *)(prim + 2);
    pGVar7 = (context->scene->geometries).items[uVar61].ptr;
    local_430 = (ulong)*(uint *)(prim + lVar65 * 4 + 6);
    uVar66 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                             pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(prim + lVar65 * 4 + 6));
    p_Var8 = pGVar7[1].intersectionFilterN;
    pvVar9 = pGVar7[2].userPtr;
    _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar150 = *(undefined1 (*) [16])(_Var10 + uVar66 * (long)pvVar9);
    pfVar1 = (float *)(_Var10 + (uVar66 + 1) * (long)pvVar9);
    fVar192 = *pfVar1;
    fVar215 = pfVar1[1];
    fVar209 = pfVar1[2];
    fVar227 = pfVar1[3];
    pfVar1 = (float *)(_Var10 + (uVar66 + 2) * (long)pvVar9);
    fVar210 = *pfVar1;
    fVar228 = pfVar1[1];
    fVar211 = pfVar1[2];
    fVar229 = pfVar1[3];
    pfVar1 = (float *)(_Var10 + (long)pvVar9 * (uVar66 + 3));
    fVar212 = *pfVar1;
    fVar230 = pfVar1[1];
    fVar213 = pfVar1[2];
    fVar232 = pfVar1[3];
    uVar67 = uVar67 - 1 & uVar67;
    lVar65 = *(long *)&pGVar7[1].time_range.upper;
    pfVar1 = (float *)(lVar65 + (long)p_Var8 * uVar66);
    fVar214 = *pfVar1;
    fVar233 = pfVar1[1];
    fVar168 = pfVar1[2];
    fVar186 = pfVar1[3];
    pfVar1 = (float *)(lVar65 + (long)p_Var8 * (uVar66 + 1));
    fVar187 = *pfVar1;
    fVar188 = pfVar1[1];
    fVar189 = pfVar1[2];
    fVar190 = pfVar1[3];
    pfVar1 = (float *)(lVar65 + (long)p_Var8 * (uVar66 + 2));
    fVar191 = *pfVar1;
    fVar298 = pfVar1[1];
    fVar259 = pfVar1[2];
    fVar304 = pfVar1[3];
    lVar11 = 0;
    if (uVar67 != 0) {
      for (; (uVar67 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    pfVar1 = (float *)(lVar65 + (long)p_Var8 * (uVar66 + 3));
    fVar260 = *pfVar1;
    fVar305 = pfVar1[1];
    fVar261 = pfVar1[2];
    fVar306 = pfVar1[3];
    if (((uVar67 != 0) && (uVar66 = uVar67 - 1 & uVar67, uVar66 != 0)) && (lVar65 = 0, uVar66 != 0))
    {
      for (; (uVar66 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
      }
    }
    local_4a8._0_4_ =
         fVar214 * 0.16666667 + fVar187 * 0.6666667 + fVar191 * 0.16666667 + fVar260 * 0.0;
    local_4a8._4_4_ =
         fVar233 * 0.16666667 + fVar188 * 0.6666667 + fVar298 * 0.16666667 + fVar305 * 0.0;
    fStack_4a0 = fVar168 * 0.16666667 + fVar189 * 0.6666667 + fVar259 * 0.16666667 + fVar261 * 0.0;
    fStack_49c = fVar186 * 0.16666667 + fVar190 * 0.6666667 + fVar304 * 0.16666667 + fVar306 * 0.0;
    auVar101._0_4_ = fVar191 * 0.5 + fVar260 * 0.0;
    auVar101._4_4_ = fVar298 * 0.5 + fVar305 * 0.0;
    auVar101._8_4_ = fVar259 * 0.5 + fVar261 * 0.0;
    auVar101._12_4_ = fVar304 * 0.5 + fVar306 * 0.0;
    auVar277._0_4_ = fVar187 * 0.0;
    auVar277._4_4_ = fVar188 * 0.0;
    auVar277._8_4_ = fVar189 * 0.0;
    auVar277._12_4_ = fVar190 * 0.0;
    auVar77 = vsubps_avx(auVar101,auVar277);
    auVar278._0_4_ = fVar214 * 0.5;
    auVar278._4_4_ = fVar233 * 0.5;
    auVar278._8_4_ = fVar168 * 0.5;
    auVar278._12_4_ = fVar186 * 0.5;
    auVar107 = vsubps_avx(auVar77,auVar278);
    fVar262 = auVar150._0_4_;
    fVar271 = auVar150._4_4_;
    fVar272 = auVar150._8_4_;
    fVar273 = auVar150._12_4_;
    auVar279._0_4_ =
         fVar262 * 0.16666667 + fVar192 * 0.6666667 + fVar210 * 0.16666667 + fVar212 * 0.0;
    auVar279._4_4_ =
         fVar271 * 0.16666667 + fVar215 * 0.6666667 + fVar228 * 0.16666667 + fVar230 * 0.0;
    auVar279._8_4_ =
         fVar272 * 0.16666667 + fVar209 * 0.6666667 + fVar211 * 0.16666667 + fVar213 * 0.0;
    auVar279._12_4_ =
         fVar273 * 0.16666667 + fVar227 * 0.6666667 + fVar229 * 0.16666667 + fVar232 * 0.0;
    auVar289._0_4_ = fVar210 * 0.5 + fVar212 * 0.0;
    auVar289._4_4_ = fVar228 * 0.5 + fVar230 * 0.0;
    auVar289._8_4_ = fVar211 * 0.5 + fVar213 * 0.0;
    auVar289._12_4_ = fVar229 * 0.5 + fVar232 * 0.0;
    auVar299._0_4_ = fVar192 * 0.0;
    auVar299._4_4_ = fVar215 * 0.0;
    auVar299._8_4_ = fVar209 * 0.0;
    auVar299._12_4_ = fVar227 * 0.0;
    auVar150 = vsubps_avx(auVar289,auVar299);
    auVar300._0_4_ = fVar262 * 0.5;
    auVar300._4_4_ = fVar271 * 0.5;
    auVar300._8_4_ = fVar272 * 0.5;
    auVar300._12_4_ = fVar273 * 0.5;
    auVar118 = vsubps_avx(auVar150,auVar300);
    auVar311._0_4_ = fVar214 * 0.0;
    auVar311._4_4_ = fVar233 * 0.0;
    auVar311._8_4_ = fVar168 * 0.0;
    auVar311._12_4_ = fVar186 * 0.0;
    local_4b8._0_4_ =
         auVar311._0_4_ + fVar187 * 0.16666667 + fVar191 * 0.6666667 + fVar260 * 0.16666667;
    local_4b8._4_4_ =
         auVar311._4_4_ + fVar188 * 0.16666667 + fVar298 * 0.6666667 + fVar305 * 0.16666667;
    fStack_4b0 = auVar311._8_4_ + fVar189 * 0.16666667 + fVar259 * 0.6666667 + fVar261 * 0.16666667;
    fStack_4ac = auVar311._12_4_ + fVar190 * 0.16666667 + fVar304 * 0.6666667 + fVar306 * 0.16666667
    ;
    auVar248._0_4_ = fVar191 * 0.0 + fVar260 * 0.5;
    auVar248._4_4_ = fVar298 * 0.0 + fVar305 * 0.5;
    auVar248._8_4_ = fVar259 * 0.0 + fVar261 * 0.5;
    auVar248._12_4_ = fVar304 * 0.0 + fVar306 * 0.5;
    auVar158._0_4_ = fVar187 * 0.5;
    auVar158._4_4_ = fVar188 * 0.5;
    auVar158._8_4_ = fVar189 * 0.5;
    auVar158._12_4_ = fVar190 * 0.5;
    auVar150 = vsubps_avx(auVar248,auVar158);
    auVar231 = vsubps_avx(auVar150,auVar311);
    auVar195._0_4_ = fVar262 * 0.0;
    auVar195._4_4_ = fVar271 * 0.0;
    auVar195._8_4_ = fVar272 * 0.0;
    auVar195._12_4_ = fVar273 * 0.0;
    auVar249._0_4_ =
         fVar192 * 0.16666667 + fVar210 * 0.6666667 + fVar212 * 0.16666667 + auVar195._0_4_;
    auVar249._4_4_ =
         fVar215 * 0.16666667 + fVar228 * 0.6666667 + fVar230 * 0.16666667 + auVar195._4_4_;
    auVar249._8_4_ =
         fVar209 * 0.16666667 + fVar211 * 0.6666667 + fVar213 * 0.16666667 + auVar195._8_4_;
    auVar249._12_4_ =
         fVar227 * 0.16666667 + fVar229 * 0.6666667 + fVar232 * 0.16666667 + auVar195._12_4_;
    auVar217._0_4_ = fVar210 * 0.0 + fVar212 * 0.5;
    auVar217._4_4_ = fVar228 * 0.0 + fVar230 * 0.5;
    auVar217._8_4_ = fVar211 * 0.0 + fVar213 * 0.5;
    auVar217._12_4_ = fVar229 * 0.0 + fVar232 * 0.5;
    auVar169._0_4_ = fVar192 * 0.5;
    auVar169._4_4_ = fVar215 * 0.5;
    auVar169._8_4_ = fVar209 * 0.5;
    auVar169._12_4_ = fVar227 * 0.5;
    auVar150 = vsubps_avx(auVar217,auVar169);
    auVar106 = vsubps_avx(auVar150,auVar195);
    auVar150 = vshufps_avx(auVar107,auVar107,0xc9);
    auVar77 = vshufps_avx(auVar279,auVar279,0xc9);
    fVar187 = auVar107._0_4_;
    auVar218._0_4_ = fVar187 * auVar77._0_4_;
    fVar188 = auVar107._4_4_;
    auVar218._4_4_ = fVar188 * auVar77._4_4_;
    fVar189 = auVar107._8_4_;
    auVar218._8_4_ = fVar189 * auVar77._8_4_;
    fVar190 = auVar107._12_4_;
    auVar218._12_4_ = fVar190 * auVar77._12_4_;
    auVar234._0_4_ = auVar279._0_4_ * auVar150._0_4_;
    auVar234._4_4_ = auVar279._4_4_ * auVar150._4_4_;
    auVar234._8_4_ = auVar279._8_4_ * auVar150._8_4_;
    auVar234._12_4_ = auVar279._12_4_ * auVar150._12_4_;
    auVar77 = vsubps_avx(auVar234,auVar218);
    auVar20 = vshufps_avx(auVar77,auVar77,0xc9);
    auVar77 = vshufps_avx(auVar118,auVar118,0xc9);
    auVar219._0_4_ = fVar187 * auVar77._0_4_;
    auVar219._4_4_ = fVar188 * auVar77._4_4_;
    auVar219._8_4_ = fVar189 * auVar77._8_4_;
    auVar219._12_4_ = fVar190 * auVar77._12_4_;
    auVar170._0_4_ = auVar118._0_4_ * auVar150._0_4_;
    auVar170._4_4_ = auVar118._4_4_ * auVar150._4_4_;
    auVar170._8_4_ = auVar118._8_4_ * auVar150._8_4_;
    auVar170._12_4_ = auVar118._12_4_ * auVar150._12_4_;
    auVar150 = vsubps_avx(auVar170,auVar219);
    auVar118 = vshufps_avx(auVar150,auVar150,0xc9);
    auVar150 = vshufps_avx(auVar231,auVar231,0xc9);
    auVar77 = vshufps_avx(auVar249,auVar249,0xc9);
    fVar214 = auVar231._0_4_;
    auVar171._0_4_ = fVar214 * auVar77._0_4_;
    fVar233 = auVar231._4_4_;
    auVar171._4_4_ = fVar233 * auVar77._4_4_;
    fVar168 = auVar231._8_4_;
    auVar171._8_4_ = fVar168 * auVar77._8_4_;
    fVar186 = auVar231._12_4_;
    auVar171._12_4_ = fVar186 * auVar77._12_4_;
    auVar250._0_4_ = auVar249._0_4_ * auVar150._0_4_;
    auVar250._4_4_ = auVar249._4_4_ * auVar150._4_4_;
    auVar250._8_4_ = auVar249._8_4_ * auVar150._8_4_;
    auVar250._12_4_ = auVar249._12_4_ * auVar150._12_4_;
    auVar77 = vsubps_avx(auVar250,auVar171);
    auVar86 = vshufps_avx(auVar77,auVar77,0xc9);
    auVar77 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar251._0_4_ = auVar77._0_4_ * fVar214;
    auVar251._4_4_ = auVar77._4_4_ * fVar233;
    auVar251._8_4_ = auVar77._8_4_ * fVar168;
    auVar251._12_4_ = auVar77._12_4_ * fVar186;
    auVar196._0_4_ = auVar150._0_4_ * auVar106._0_4_;
    auVar196._4_4_ = auVar150._4_4_ * auVar106._4_4_;
    auVar196._8_4_ = auVar150._8_4_ * auVar106._8_4_;
    auVar196._12_4_ = auVar150._12_4_ * auVar106._12_4_;
    auVar150 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar77 = vsubps_avx(auVar196,auVar251);
    auVar106 = vshufps_avx(auVar77,auVar77,0xc9);
    fVar210 = auVar150._0_4_;
    auVar252 = ZEXT416((uint)fVar210);
    auVar77 = vrsqrtss_avx(auVar252,auVar252);
    fVar192 = auVar77._0_4_;
    auVar77 = ZEXT416((uint)(fVar192 * 1.5 - fVar210 * 0.5 * fVar192 * fVar192 * fVar192));
    auVar136 = vshufps_avx(auVar77,auVar77,0);
    fVar192 = auVar136._0_4_ * auVar20._0_4_;
    fVar215 = auVar136._4_4_ * auVar20._4_4_;
    fVar209 = auVar136._8_4_ * auVar20._8_4_;
    fVar227 = auVar136._12_4_ * auVar20._12_4_;
    auVar77 = vdpps_avx(auVar20,auVar118,0x7f);
    auVar150 = vshufps_avx(auVar150,auVar150,0);
    auVar263._0_4_ = auVar118._0_4_ * auVar150._0_4_;
    auVar263._4_4_ = auVar118._4_4_ * auVar150._4_4_;
    auVar263._8_4_ = auVar118._8_4_ * auVar150._8_4_;
    auVar263._12_4_ = auVar118._12_4_ * auVar150._12_4_;
    auVar150 = vshufps_avx(auVar77,auVar77,0);
    auVar235._0_4_ = auVar150._0_4_ * auVar20._0_4_;
    auVar235._4_4_ = auVar150._4_4_ * auVar20._4_4_;
    auVar235._8_4_ = auVar150._8_4_ * auVar20._8_4_;
    auVar235._12_4_ = auVar150._12_4_ * auVar20._12_4_;
    auVar5 = vsubps_avx(auVar263,auVar235);
    auVar150 = vrcpss_avx(auVar252,auVar252);
    auVar150 = ZEXT416((uint)(auVar150._0_4_ * (2.0 - fVar210 * auVar150._0_4_)));
    auVar20 = vshufps_avx(auVar150,auVar150,0);
    auVar150 = vdpps_avx(auVar86,auVar86,0x7f);
    fVar210 = auVar150._0_4_;
    auVar252 = ZEXT416((uint)fVar210);
    auVar77 = vrsqrtss_avx(auVar252,auVar252);
    fVar228 = auVar77._0_4_;
    auVar77 = vdpps_avx(auVar86,auVar106,0x7f);
    auVar118 = ZEXT416((uint)(fVar228 * 1.5 - fVar210 * 0.5 * fVar228 * fVar228 * fVar228));
    auVar118 = vshufps_avx(auVar118,auVar118,0);
    fVar228 = auVar118._0_4_ * auVar86._0_4_;
    fVar211 = auVar118._4_4_ * auVar86._4_4_;
    fVar229 = auVar118._8_4_ * auVar86._8_4_;
    fVar212 = auVar118._12_4_ * auVar86._12_4_;
    auVar150 = vshufps_avx(auVar150,auVar150,0);
    auVar220._0_4_ = auVar150._0_4_ * auVar106._0_4_;
    auVar220._4_4_ = auVar150._4_4_ * auVar106._4_4_;
    auVar220._8_4_ = auVar150._8_4_ * auVar106._8_4_;
    auVar220._12_4_ = auVar150._12_4_ * auVar106._12_4_;
    auVar150 = vshufps_avx(auVar77,auVar77,0);
    auVar172._0_4_ = auVar150._0_4_ * auVar86._0_4_;
    auVar172._4_4_ = auVar150._4_4_ * auVar86._4_4_;
    auVar172._8_4_ = auVar150._8_4_ * auVar86._8_4_;
    auVar172._12_4_ = auVar150._12_4_ * auVar86._12_4_;
    auVar106 = vsubps_avx(auVar220,auVar172);
    auVar150 = vrcpss_avx(auVar252,auVar252);
    auVar150 = ZEXT416((uint)((2.0 - fVar210 * auVar150._0_4_) * auVar150._0_4_));
    auVar150 = vshufps_avx(auVar150,auVar150,0);
    auVar77 = vshufps_avx(_local_4a8,_local_4a8,0xff);
    auVar253._0_4_ = auVar77._0_4_ * fVar192;
    auVar253._4_4_ = auVar77._4_4_ * fVar215;
    auVar253._8_4_ = auVar77._8_4_ * fVar209;
    auVar253._12_4_ = auVar77._12_4_ * fVar227;
    _local_3a8 = vsubps_avx(_local_4a8,auVar253);
    auVar86 = vshufps_avx(auVar107,auVar107,0xff);
    auVar197._0_4_ =
         auVar86._0_4_ * fVar192 + auVar77._0_4_ * auVar136._0_4_ * auVar20._0_4_ * auVar5._0_4_;
    auVar197._4_4_ =
         auVar86._4_4_ * fVar215 + auVar77._4_4_ * auVar136._4_4_ * auVar20._4_4_ * auVar5._4_4_;
    auVar197._8_4_ =
         auVar86._8_4_ * fVar209 + auVar77._8_4_ * auVar136._8_4_ * auVar20._8_4_ * auVar5._8_4_;
    auVar197._12_4_ =
         auVar86._12_4_ * fVar227 +
         auVar77._12_4_ * auVar136._12_4_ * auVar20._12_4_ * auVar5._12_4_;
    auVar86 = vsubps_avx(auVar107,auVar197);
    local_3b8._0_4_ = auVar253._0_4_ + (float)local_4a8._0_4_;
    local_3b8._4_4_ = auVar253._4_4_ + (float)local_4a8._4_4_;
    fStack_3b0 = auVar253._8_4_ + fStack_4a0;
    fStack_3ac = auVar253._12_4_ + fStack_49c;
    auVar77 = vshufps_avx(_local_4b8,_local_4b8,0xff);
    auVar102._0_4_ = fVar228 * auVar77._0_4_;
    auVar102._4_4_ = fVar211 * auVar77._4_4_;
    auVar102._8_4_ = fVar229 * auVar77._8_4_;
    auVar102._12_4_ = fVar212 * auVar77._12_4_;
    _local_3c8 = vsubps_avx(_local_4b8,auVar102);
    auVar20 = vshufps_avx(auVar231,auVar231,0xff);
    auVar70._0_4_ =
         fVar228 * auVar20._0_4_ + auVar77._0_4_ * auVar118._0_4_ * auVar106._0_4_ * auVar150._0_4_;
    auVar70._4_4_ =
         fVar211 * auVar20._4_4_ + auVar77._4_4_ * auVar118._4_4_ * auVar106._4_4_ * auVar150._4_4_;
    auVar70._8_4_ =
         fVar229 * auVar20._8_4_ + auVar77._8_4_ * auVar118._8_4_ * auVar106._8_4_ * auVar150._8_4_;
    auVar70._12_4_ =
         fVar212 * auVar20._12_4_ +
         auVar77._12_4_ * auVar118._12_4_ * auVar106._12_4_ * auVar150._12_4_;
    auVar150 = vsubps_avx(auVar231,auVar70);
    local_3d8._0_4_ = (float)local_4b8._0_4_ + auVar102._0_4_;
    local_3d8._4_4_ = (float)local_4b8._4_4_ + auVar102._4_4_;
    fStack_3d0 = fStack_4b0 + auVar102._8_4_;
    fStack_3cc = fStack_4ac + auVar102._12_4_;
    local_3e8._0_4_ = local_3a8._0_4_ + auVar86._0_4_ * 0.33333334;
    local_3e8._4_4_ = local_3a8._4_4_ + auVar86._4_4_ * 0.33333334;
    fStack_3e0 = local_3a8._8_4_ + auVar86._8_4_ * 0.33333334;
    fStack_3dc = local_3a8._12_4_ + auVar86._12_4_ * 0.33333334;
    auVar71._0_4_ = auVar150._0_4_ * 0.33333334;
    auVar71._4_4_ = auVar150._4_4_ * 0.33333334;
    auVar71._8_4_ = auVar150._8_4_ * 0.33333334;
    auVar71._12_4_ = auVar150._12_4_ * 0.33333334;
    _local_3f8 = vsubps_avx(_local_3c8,auVar71);
    aVar4 = (ray->super_RayK<1>).org.field_0;
    auVar20 = vsubps_avx(_local_3a8,(undefined1  [16])aVar4);
    auVar77 = vmovsldup_avx(auVar20);
    auVar150 = vmovshdup_avx(auVar20);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    fVar192 = (pre->ray_space).vx.field_0.m128[0];
    fVar215 = (pre->ray_space).vx.field_0.m128[1];
    fVar209 = (pre->ray_space).vx.field_0.m128[2];
    fVar227 = (pre->ray_space).vx.field_0.m128[3];
    fVar210 = (pre->ray_space).vy.field_0.m128[0];
    fVar228 = (pre->ray_space).vy.field_0.m128[1];
    fVar211 = (pre->ray_space).vy.field_0.m128[2];
    fVar229 = (pre->ray_space).vy.field_0.m128[3];
    fVar212 = (pre->ray_space).vz.field_0.m128[0];
    fVar230 = (pre->ray_space).vz.field_0.m128[1];
    fVar213 = (pre->ray_space).vz.field_0.m128[2];
    fVar232 = (pre->ray_space).vz.field_0.m128[3];
    local_4a8._4_4_ = fVar215 * auVar77._4_4_ + fVar228 * auVar150._4_4_ + fVar230 * auVar20._4_4_;
    local_4a8._0_4_ = fVar192 * auVar77._0_4_ + fVar210 * auVar150._0_4_ + fVar212 * auVar20._0_4_;
    fStack_4a0 = fVar209 * auVar77._8_4_ + fVar211 * auVar150._8_4_ + fVar213 * auVar20._8_4_;
    fStack_49c = fVar227 * auVar77._12_4_ + fVar229 * auVar150._12_4_ + fVar232 * auVar20._12_4_;
    auVar20 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
    auVar77 = vmovsldup_avx(auVar20);
    auVar150 = vmovshdup_avx(auVar20);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    local_4b8._4_4_ = fVar215 * auVar77._4_4_ + auVar150._4_4_ * fVar228 + fVar230 * auVar20._4_4_;
    local_4b8._0_4_ = fVar192 * auVar77._0_4_ + auVar150._0_4_ * fVar210 + fVar212 * auVar20._0_4_;
    fStack_4b0 = fVar209 * auVar77._8_4_ + auVar150._8_4_ * fVar211 + fVar213 * auVar20._8_4_;
    fStack_4ac = fVar227 * auVar77._12_4_ + auVar150._12_4_ * fVar229 + fVar232 * auVar20._12_4_;
    auVar77 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    local_4c8._4_4_ = auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230 + fVar215 * auVar77._4_4_;
    local_4c8._0_4_ = auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212 + fVar192 * auVar77._0_4_;
    fStack_4c0 = auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213 + fVar209 * auVar77._8_4_;
    fStack_4bc = auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232 + fVar227 * auVar77._12_4_;
    auVar77 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    auVar264._0_8_ =
         CONCAT44(auVar77._4_4_ * fVar215 + auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230,
                  auVar77._0_4_ * fVar192 + auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212);
    auVar264._8_4_ = auVar77._8_4_ * fVar209 + auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213;
    auVar264._12_4_ =
         auVar77._12_4_ * fVar227 + auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232;
    auVar77 = vsubps_avx(_local_3b8,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    auVar323._0_8_ =
         CONCAT44(auVar77._4_4_ * fVar215 + auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230,
                  auVar77._0_4_ * fVar192 + auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212);
    auVar323._8_4_ = auVar77._8_4_ * fVar209 + auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213;
    auVar323._12_4_ =
         auVar77._12_4_ * fVar227 + auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232;
    local_408._0_4_ = (fVar187 + auVar197._0_4_) * 0.33333334 + (float)local_3b8._0_4_;
    local_408._4_4_ = (fVar188 + auVar197._4_4_) * 0.33333334 + (float)local_3b8._4_4_;
    fStack_400 = (fVar189 + auVar197._8_4_) * 0.33333334 + fStack_3b0;
    fStack_3fc = (fVar190 + auVar197._12_4_) * 0.33333334 + fStack_3ac;
    auVar77 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    auVar280._0_8_ =
         CONCAT44(auVar77._4_4_ * fVar215 + auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230,
                  auVar77._0_4_ * fVar192 + auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212);
    auVar280._8_4_ = auVar77._8_4_ * fVar209 + auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213;
    auVar280._12_4_ =
         auVar77._12_4_ * fVar227 + auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232;
    auVar236._0_4_ = (fVar214 + auVar70._0_4_) * 0.33333334;
    auVar236._4_4_ = (fVar233 + auVar70._4_4_) * 0.33333334;
    auVar236._8_4_ = (fVar168 + auVar70._8_4_) * 0.33333334;
    auVar236._12_4_ = (fVar186 + auVar70._12_4_) * 0.33333334;
    _local_2e8 = vsubps_avx(_local_3d8,auVar236);
    auVar77 = vsubps_avx(_local_2e8,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    auVar103._0_8_ =
         CONCAT44(auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230 + fVar215 * auVar77._4_4_,
                  auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212 + fVar192 * auVar77._0_4_);
    auVar103._8_4_ = auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213 + fVar209 * auVar77._8_4_;
    auVar103._12_4_ =
         auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232 + fVar227 * auVar77._12_4_;
    auVar77 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
    auVar20 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar150 = vmovshdup_avx(auVar77);
    auVar77 = vmovsldup_avx(auVar77);
    auVar72._0_8_ =
         CONCAT44(fVar215 * auVar77._4_4_ + auVar150._4_4_ * fVar228 + auVar20._4_4_ * fVar230,
                  fVar192 * auVar77._0_4_ + auVar150._0_4_ * fVar210 + auVar20._0_4_ * fVar212);
    auVar72._8_4_ = fVar209 * auVar77._8_4_ + auVar150._8_4_ * fVar211 + auVar20._8_4_ * fVar213;
    auVar72._12_4_ = fVar227 * auVar77._12_4_ + auVar150._12_4_ * fVar229 + auVar20._12_4_ * fVar232
    ;
    auVar118 = vmovlhps_avx(_local_4a8,auVar323);
    auVar86 = vmovlhps_avx(_local_4b8,auVar280);
    auVar106 = vmovlhps_avx(_local_4c8,auVar103);
    _local_1e8 = vmovlhps_avx(auVar264,auVar72);
    auVar150 = vminps_avx(auVar118,auVar86);
    auVar77 = vminps_avx(auVar106,_local_1e8);
    auVar20 = vminps_avx(auVar150,auVar77);
    auVar150 = vmaxps_avx(auVar118,auVar86);
    auVar77 = vmaxps_avx(auVar106,_local_1e8);
    auVar150 = vmaxps_avx(auVar150,auVar77);
    auVar77 = vshufpd_avx(auVar20,auVar20,3);
    auVar20 = vminps_avx(auVar20,auVar77);
    auVar77 = vshufpd_avx(auVar150,auVar150,3);
    auVar77 = vmaxps_avx(auVar150,auVar77);
    auVar221._8_4_ = 0x7fffffff;
    auVar221._0_8_ = 0x7fffffff7fffffff;
    auVar221._12_4_ = 0x7fffffff;
    auVar150 = vandps_avx(auVar20,auVar221);
    auVar77 = vandps_avx(auVar77,auVar221);
    auVar150 = vmaxps_avx(auVar150,auVar77);
    auVar77 = vmovshdup_avx(auVar150);
    auVar150 = vmaxss_avx(auVar77,auVar150);
    fVar192 = auVar150._0_4_ * 9.536743e-07;
    local_388._8_8_ = local_4a8;
    local_388._0_8_ = local_4a8;
    auVar226 = ZEXT1664(local_388);
    local_448._8_8_ = local_4b8;
    local_448._0_8_ = local_4b8;
    auVar247 = ZEXT1664(local_448);
    local_458._8_8_ = local_4c8;
    local_458._0_8_ = local_4c8;
    auVar258 = ZEXT1664(local_458);
    local_468._8_8_ = auVar264._0_8_;
    local_468._0_8_ = auVar264._0_8_;
    auVar270 = ZEXT1664(local_468);
    register0x00001348 = auVar323._0_8_;
    local_398 = auVar323._0_8_;
    auVar208 = ZEXT1664(_local_398);
    local_478._8_8_ = auVar280._0_8_;
    local_478._0_8_ = auVar280._0_8_;
    auVar288 = ZEXT1664(local_478);
    local_488._8_8_ = auVar103._0_8_;
    local_488._0_8_ = auVar103._0_8_;
    auVar326 = ZEXT1664(local_488);
    local_498._8_8_ = auVar72._0_8_;
    local_498._0_8_ = auVar72._0_8_;
    auVar303 = ZEXT1664(local_498);
    local_1f8 = ZEXT416((uint)fVar192);
    auVar150 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
    local_78._16_16_ = auVar150;
    local_78._0_16_ = auVar150;
    auVar73._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
    auVar73._8_4_ = auVar150._8_4_ ^ 0x80000000;
    auVar73._12_4_ = auVar150._12_4_ ^ 0x80000000;
    local_1d8._16_16_ = auVar73;
    local_1d8._0_16_ = auVar73;
    uVar68 = 0;
    _local_4a8 = auVar118;
    _local_208 = vsubps_avx(auVar86,auVar118);
    _local_4b8 = auVar86;
    _local_218 = vsubps_avx(auVar106,auVar86);
    _local_4c8 = auVar106;
    _local_228 = vsubps_avx(_local_1e8,auVar106);
    _local_248 = vsubps_avx(_local_3b8,_local_3a8);
    _local_258 = vsubps_avx(_local_408,_local_3e8);
    _local_268 = vsubps_avx(_local_2e8,_local_3f8);
    _local_278 = vsubps_avx(_local_3d8,_local_3c8);
    auVar315 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar297 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_010319cb:
    local_238 = auVar297._0_16_;
    auVar252 = auVar315._0_16_;
    auVar150 = vshufps_avx(auVar252,auVar252,0x50);
    auVar317._8_4_ = 0x3f800000;
    auVar317._0_8_ = 0x3f8000003f800000;
    auVar317._12_4_ = 0x3f800000;
    auVar322._16_4_ = 0x3f800000;
    auVar322._0_16_ = auVar317;
    auVar322._20_4_ = 0x3f800000;
    auVar322._24_4_ = 0x3f800000;
    auVar322._28_4_ = 0x3f800000;
    auVar77 = vsubps_avx(auVar317,auVar150);
    fVar192 = auVar150._0_4_;
    fVar215 = auVar150._4_4_;
    fVar209 = auVar150._8_4_;
    fVar227 = auVar150._12_4_;
    fVar210 = auVar77._0_4_;
    fVar228 = auVar77._4_4_;
    fVar211 = auVar77._8_4_;
    fVar229 = auVar77._12_4_;
    auVar159._0_4_ = auVar208._0_4_ * fVar192 + fVar210 * auVar226._0_4_;
    auVar159._4_4_ = auVar208._4_4_ * fVar215 + fVar228 * auVar226._4_4_;
    auVar159._8_4_ = auVar208._8_4_ * fVar209 + fVar211 * auVar226._8_4_;
    auVar159._12_4_ = auVar208._12_4_ * fVar227 + fVar229 * auVar226._12_4_;
    auVar133._0_4_ = auVar288._0_4_ * fVar192 + fVar210 * auVar247._0_4_;
    auVar133._4_4_ = auVar288._4_4_ * fVar215 + fVar228 * auVar247._4_4_;
    auVar133._8_4_ = auVar288._8_4_ * fVar209 + fVar211 * auVar247._8_4_;
    auVar133._12_4_ = auVar288._12_4_ * fVar227 + fVar229 * auVar247._12_4_;
    auVar237._0_4_ = auVar326._0_4_ * fVar192 + auVar258._0_4_ * fVar210;
    auVar237._4_4_ = auVar326._4_4_ * fVar215 + auVar258._4_4_ * fVar228;
    auVar237._8_4_ = auVar326._8_4_ * fVar209 + auVar258._8_4_ * fVar211;
    auVar237._12_4_ = auVar326._12_4_ * fVar227 + auVar258._12_4_ * fVar229;
    auVar173._0_4_ = auVar303._0_4_ * fVar192 + auVar270._0_4_ * fVar210;
    auVar173._4_4_ = auVar303._4_4_ * fVar215 + auVar270._4_4_ * fVar228;
    auVar173._8_4_ = auVar303._8_4_ * fVar209 + auVar270._8_4_ * fVar211;
    auVar173._12_4_ = auVar303._12_4_ * fVar227 + auVar270._12_4_ * fVar229;
    auVar150 = vmovshdup_avx(local_238);
    auVar77 = vshufps_avx(local_238,local_238,0);
    auVar268._16_16_ = auVar77;
    auVar268._0_16_ = auVar77;
    auVar20 = vshufps_avx(local_238,local_238,0x55);
    auVar93._16_16_ = auVar20;
    auVar93._0_16_ = auVar20;
    auVar89 = vsubps_avx(auVar93,auVar268);
    auVar20 = vshufps_avx(auVar159,auVar159,0);
    auVar118 = vshufps_avx(auVar159,auVar159,0x55);
    auVar86 = vshufps_avx(auVar133,auVar133,0);
    auVar106 = vshufps_avx(auVar133,auVar133,0x55);
    auVar136 = vshufps_avx(auVar237,auVar237,0);
    auVar107 = vshufps_avx(auVar237,auVar237,0x55);
    auVar231 = vshufps_avx(auVar173,auVar173,0);
    auVar5 = vshufps_avx(auVar173,auVar173,0x55);
    auVar150 = ZEXT416((uint)((auVar150._0_4_ - auVar297._0_4_) * 0.04761905));
    auVar150 = vshufps_avx(auVar150,auVar150,0);
    auVar287._0_4_ = auVar77._0_4_ + auVar89._0_4_ * 0.0;
    auVar287._4_4_ = auVar77._4_4_ + auVar89._4_4_ * 0.14285715;
    auVar287._8_4_ = auVar77._8_4_ + auVar89._8_4_ * 0.2857143;
    auVar287._12_4_ = auVar77._12_4_ + auVar89._12_4_ * 0.42857146;
    auVar287._16_4_ = auVar77._0_4_ + auVar89._16_4_ * 0.5714286;
    auVar287._20_4_ = auVar77._4_4_ + auVar89._20_4_ * 0.71428573;
    auVar287._24_4_ = auVar77._8_4_ + auVar89._24_4_ * 0.8571429;
    auVar287._28_4_ = auVar77._12_4_ + auVar89._28_4_;
    auVar12 = vsubps_avx(auVar322,auVar287);
    fVar192 = auVar86._0_4_;
    fVar209 = auVar86._4_4_;
    fVar210 = auVar86._8_4_;
    fVar211 = auVar86._12_4_;
    fVar262 = auVar12._0_4_;
    fVar271 = auVar12._4_4_;
    fVar272 = auVar12._8_4_;
    fVar273 = auVar12._12_4_;
    fVar274 = auVar12._16_4_;
    fVar275 = auVar12._20_4_;
    fVar276 = auVar12._24_4_;
    fVar191 = auVar106._0_4_;
    fVar259 = auVar106._4_4_;
    fVar260 = auVar106._8_4_;
    fVar261 = auVar106._12_4_;
    fVar316 = auVar118._12_4_ + 1.0;
    fVar187 = auVar136._0_4_;
    fVar188 = auVar136._4_4_;
    fVar189 = auVar136._8_4_;
    fVar190 = auVar136._12_4_;
    fVar212 = fVar187 * auVar287._0_4_ + fVar262 * fVar192;
    fVar230 = fVar188 * auVar287._4_4_ + fVar271 * fVar209;
    fVar213 = fVar189 * auVar287._8_4_ + fVar272 * fVar210;
    fVar232 = fVar190 * auVar287._12_4_ + fVar273 * fVar211;
    fVar214 = fVar187 * auVar287._16_4_ + fVar274 * fVar192;
    fVar233 = fVar188 * auVar287._20_4_ + fVar275 * fVar209;
    fVar168 = fVar189 * auVar287._24_4_ + fVar276 * fVar210;
    fVar215 = auVar107._0_4_;
    fVar227 = auVar107._4_4_;
    fVar228 = auVar107._8_4_;
    fVar229 = auVar107._12_4_;
    fVar298 = fVar191 * fVar262 + auVar287._0_4_ * fVar215;
    fVar304 = fVar259 * fVar271 + auVar287._4_4_ * fVar227;
    fVar305 = fVar260 * fVar272 + auVar287._8_4_ * fVar228;
    fVar306 = fVar261 * fVar273 + auVar287._12_4_ * fVar229;
    fVar307 = fVar191 * fVar274 + auVar287._16_4_ * fVar215;
    fVar308 = fVar259 * fVar275 + auVar287._20_4_ * fVar227;
    fVar309 = fVar260 * fVar276 + auVar287._24_4_ * fVar228;
    fVar310 = fVar261 + fVar211;
    auVar77 = vshufps_avx(auVar159,auVar159,0xaa);
    auVar86 = vshufps_avx(auVar159,auVar159,0xff);
    fVar186 = fVar190 + 0.0;
    auVar106 = vshufps_avx(auVar133,auVar133,0xaa);
    auVar136 = vshufps_avx(auVar133,auVar133,0xff);
    auVar184._0_4_ =
         fVar262 * (auVar287._0_4_ * fVar192 + fVar262 * auVar20._0_4_) + auVar287._0_4_ * fVar212;
    auVar184._4_4_ =
         fVar271 * (auVar287._4_4_ * fVar209 + fVar271 * auVar20._4_4_) + auVar287._4_4_ * fVar230;
    auVar184._8_4_ =
         fVar272 * (auVar287._8_4_ * fVar210 + fVar272 * auVar20._8_4_) + auVar287._8_4_ * fVar213;
    auVar184._12_4_ =
         fVar273 * (auVar287._12_4_ * fVar211 + fVar273 * auVar20._12_4_) +
         auVar287._12_4_ * fVar232;
    auVar184._16_4_ =
         fVar274 * (auVar287._16_4_ * fVar192 + fVar274 * auVar20._0_4_) + auVar287._16_4_ * fVar214
    ;
    auVar184._20_4_ =
         fVar275 * (auVar287._20_4_ * fVar209 + fVar275 * auVar20._4_4_) + auVar287._20_4_ * fVar233
    ;
    auVar184._24_4_ =
         fVar276 * (auVar287._24_4_ * fVar210 + fVar276 * auVar20._8_4_) + auVar287._24_4_ * fVar168
    ;
    auVar184._28_4_ = auVar20._12_4_ + 1.0 + fVar229;
    auVar206._0_4_ =
         fVar262 * (fVar191 * auVar287._0_4_ + auVar118._0_4_ * fVar262) + auVar287._0_4_ * fVar298;
    auVar206._4_4_ =
         fVar271 * (fVar259 * auVar287._4_4_ + auVar118._4_4_ * fVar271) + auVar287._4_4_ * fVar304;
    auVar206._8_4_ =
         fVar272 * (fVar260 * auVar287._8_4_ + auVar118._8_4_ * fVar272) + auVar287._8_4_ * fVar305;
    auVar206._12_4_ =
         fVar273 * (fVar261 * auVar287._12_4_ + auVar118._12_4_ * fVar273) +
         auVar287._12_4_ * fVar306;
    auVar206._16_4_ =
         fVar274 * (fVar191 * auVar287._16_4_ + auVar118._0_4_ * fVar274) +
         auVar287._16_4_ * fVar307;
    auVar206._20_4_ =
         fVar275 * (fVar259 * auVar287._20_4_ + auVar118._4_4_ * fVar275) +
         auVar287._20_4_ * fVar308;
    auVar206._24_4_ =
         fVar276 * (fVar260 * auVar287._24_4_ + auVar118._8_4_ * fVar276) +
         auVar287._24_4_ * fVar309;
    auVar206._28_4_ = auVar5._12_4_ + fVar229;
    auVar94._0_4_ =
         fVar262 * fVar212 + auVar287._0_4_ * (fVar187 * fVar262 + auVar231._0_4_ * auVar287._0_4_);
    auVar94._4_4_ =
         fVar271 * fVar230 + auVar287._4_4_ * (fVar188 * fVar271 + auVar231._4_4_ * auVar287._4_4_);
    auVar94._8_4_ =
         fVar272 * fVar213 + auVar287._8_4_ * (fVar189 * fVar272 + auVar231._8_4_ * auVar287._8_4_);
    auVar94._12_4_ =
         fVar273 * fVar232 +
         auVar287._12_4_ * (fVar190 * fVar273 + auVar231._12_4_ * auVar287._12_4_);
    auVar94._16_4_ =
         fVar274 * fVar214 +
         auVar287._16_4_ * (fVar187 * fVar274 + auVar231._0_4_ * auVar287._16_4_);
    auVar94._20_4_ =
         fVar275 * fVar233 +
         auVar287._20_4_ * (fVar188 * fVar275 + auVar231._4_4_ * auVar287._20_4_);
    auVar94._24_4_ =
         fVar276 * fVar168 +
         auVar287._24_4_ * (fVar189 * fVar276 + auVar231._8_4_ * auVar287._24_4_);
    auVar94._28_4_ = fVar211 + 1.0 + fVar186;
    auVar296._0_4_ =
         fVar262 * fVar298 + auVar287._0_4_ * (auVar5._0_4_ * auVar287._0_4_ + fVar262 * fVar215);
    auVar296._4_4_ =
         fVar271 * fVar304 + auVar287._4_4_ * (auVar5._4_4_ * auVar287._4_4_ + fVar271 * fVar227);
    auVar296._8_4_ =
         fVar272 * fVar305 + auVar287._8_4_ * (auVar5._8_4_ * auVar287._8_4_ + fVar272 * fVar228);
    auVar296._12_4_ =
         fVar273 * fVar306 + auVar287._12_4_ * (auVar5._12_4_ * auVar287._12_4_ + fVar273 * fVar229)
    ;
    auVar296._16_4_ =
         fVar274 * fVar307 + auVar287._16_4_ * (auVar5._0_4_ * auVar287._16_4_ + fVar274 * fVar215);
    auVar296._20_4_ =
         fVar275 * fVar308 + auVar287._20_4_ * (auVar5._4_4_ * auVar287._20_4_ + fVar275 * fVar227);
    auVar296._24_4_ =
         fVar276 * fVar309 + auVar287._24_4_ * (auVar5._8_4_ * auVar287._24_4_ + fVar276 * fVar228);
    auVar296._28_4_ = fVar186 + fVar229 + 0.0;
    local_b8._0_4_ = fVar262 * auVar184._0_4_ + auVar287._0_4_ * auVar94._0_4_;
    local_b8._4_4_ = fVar271 * auVar184._4_4_ + auVar287._4_4_ * auVar94._4_4_;
    local_b8._8_4_ = fVar272 * auVar184._8_4_ + auVar287._8_4_ * auVar94._8_4_;
    local_b8._12_4_ = fVar273 * auVar184._12_4_ + auVar287._12_4_ * auVar94._12_4_;
    local_b8._16_4_ = fVar274 * auVar184._16_4_ + auVar287._16_4_ * auVar94._16_4_;
    local_b8._20_4_ = fVar275 * auVar184._20_4_ + auVar287._20_4_ * auVar94._20_4_;
    local_b8._24_4_ = fVar276 * auVar184._24_4_ + auVar287._24_4_ * auVar94._24_4_;
    local_b8._28_4_ = fVar310 + fVar229 + 0.0;
    auVar167._0_4_ = fVar262 * auVar206._0_4_ + auVar287._0_4_ * auVar296._0_4_;
    auVar167._4_4_ = fVar271 * auVar206._4_4_ + auVar287._4_4_ * auVar296._4_4_;
    auVar167._8_4_ = fVar272 * auVar206._8_4_ + auVar287._8_4_ * auVar296._8_4_;
    auVar167._12_4_ = fVar273 * auVar206._12_4_ + auVar287._12_4_ * auVar296._12_4_;
    auVar167._16_4_ = fVar274 * auVar206._16_4_ + auVar287._16_4_ * auVar296._16_4_;
    auVar167._20_4_ = fVar275 * auVar206._20_4_ + auVar287._20_4_ * auVar296._20_4_;
    auVar167._24_4_ = fVar276 * auVar206._24_4_ + auVar287._24_4_ * auVar296._24_4_;
    auVar167._28_4_ = fVar310 + fVar186;
    auVar13 = vsubps_avx(auVar94,auVar184);
    auVar89 = vsubps_avx(auVar296,auVar206);
    local_378._0_4_ = auVar150._0_4_;
    local_378._4_4_ = auVar150._4_4_;
    fStack_370 = auVar150._8_4_;
    fStack_36c = auVar150._12_4_;
    local_f8 = (float)local_378._0_4_ * auVar13._0_4_ * 3.0;
    fStack_f4 = (float)local_378._4_4_ * auVar13._4_4_ * 3.0;
    auVar23._4_4_ = fStack_f4;
    auVar23._0_4_ = local_f8;
    fStack_f0 = fStack_370 * auVar13._8_4_ * 3.0;
    auVar23._8_4_ = fStack_f0;
    fStack_ec = fStack_36c * auVar13._12_4_ * 3.0;
    auVar23._12_4_ = fStack_ec;
    fStack_e8 = (float)local_378._0_4_ * auVar13._16_4_ * 3.0;
    auVar23._16_4_ = fStack_e8;
    fStack_e4 = (float)local_378._4_4_ * auVar13._20_4_ * 3.0;
    auVar23._20_4_ = fStack_e4;
    fStack_e0 = fStack_370 * auVar13._24_4_ * 3.0;
    auVar23._24_4_ = fStack_e0;
    auVar23._28_4_ = auVar13._28_4_;
    local_118 = (float)local_378._0_4_ * auVar89._0_4_ * 3.0;
    fStack_114 = (float)local_378._4_4_ * auVar89._4_4_ * 3.0;
    auVar24._4_4_ = fStack_114;
    auVar24._0_4_ = local_118;
    fStack_110 = fStack_370 * auVar89._8_4_ * 3.0;
    auVar24._8_4_ = fStack_110;
    fStack_10c = fStack_36c * auVar89._12_4_ * 3.0;
    auVar24._12_4_ = fStack_10c;
    fStack_108 = (float)local_378._0_4_ * auVar89._16_4_ * 3.0;
    auVar24._16_4_ = fStack_108;
    fStack_104 = (float)local_378._4_4_ * auVar89._20_4_ * 3.0;
    auVar24._20_4_ = fStack_104;
    fStack_100 = fStack_370 * auVar89._24_4_ * 3.0;
    auVar24._24_4_ = fStack_100;
    auVar24._28_4_ = fVar310;
    auVar14 = vsubps_avx(local_b8,auVar23);
    auVar89 = vperm2f128_avx(auVar14,auVar14,1);
    auVar89 = vshufps_avx(auVar89,auVar14,0x30);
    _local_308 = vshufps_avx(auVar14,auVar89,0x29);
    auVar14 = vsubps_avx(auVar167,auVar24);
    auVar89 = vperm2f128_avx(auVar14,auVar14,1);
    auVar89 = vshufps_avx(auVar89,auVar14,0x30);
    _local_358 = vshufps_avx(auVar14,auVar89,0x29);
    auVar125 = _local_358;
    fVar308 = auVar106._0_4_;
    fVar309 = auVar106._4_4_;
    fVar327 = auVar106._8_4_;
    fVar211 = auVar77._12_4_;
    fVar188 = auVar136._0_4_;
    fVar190 = auVar136._4_4_;
    fVar298 = auVar136._8_4_;
    fVar304 = auVar136._12_4_;
    auVar150 = vshufps_avx(auVar237,auVar237,0xaa);
    fVar192 = auVar150._0_4_;
    fVar209 = auVar150._4_4_;
    fVar210 = auVar150._8_4_;
    fVar229 = auVar150._12_4_;
    fVar213 = auVar287._0_4_ * fVar192 + fVar308 * fVar262;
    fVar232 = auVar287._4_4_ * fVar209 + fVar309 * fVar271;
    fVar214 = auVar287._8_4_ * fVar210 + fVar327 * fVar272;
    fVar233 = auVar287._12_4_ * fVar229 + auVar106._12_4_ * fVar273;
    fVar168 = auVar287._16_4_ * fVar192 + fVar308 * fVar274;
    fVar186 = auVar287._20_4_ * fVar209 + fVar309 * fVar275;
    fVar187 = auVar287._24_4_ * fVar210 + fVar327 * fVar276;
    auVar150 = vshufps_avx(auVar237,auVar237,0xff);
    fVar215 = auVar150._0_4_;
    fVar227 = auVar150._4_4_;
    fVar228 = auVar150._8_4_;
    fVar212 = auVar150._12_4_;
    fVar189 = auVar287._0_4_ * fVar215 + fVar188 * fVar262;
    fVar191 = auVar287._4_4_ * fVar227 + fVar190 * fVar271;
    fVar259 = auVar287._8_4_ * fVar228 + fVar298 * fVar272;
    fVar260 = auVar287._12_4_ * fVar212 + fVar304 * fVar273;
    fVar305 = auVar287._16_4_ * fVar215 + fVar188 * fVar274;
    fVar261 = auVar287._20_4_ * fVar227 + fVar190 * fVar275;
    fVar306 = auVar287._24_4_ * fVar228 + fVar298 * fVar276;
    auVar150 = vshufps_avx(auVar173,auVar173,0xaa);
    fVar307 = auVar150._12_4_ + fVar229;
    auVar20 = vshufps_avx(auVar173,auVar173,0xff);
    fVar230 = auVar20._12_4_;
    auVar95._0_4_ =
         fVar262 * (fVar308 * auVar287._0_4_ + fVar262 * auVar77._0_4_) + auVar287._0_4_ * fVar213;
    auVar95._4_4_ =
         fVar271 * (fVar309 * auVar287._4_4_ + fVar271 * auVar77._4_4_) + auVar287._4_4_ * fVar232;
    auVar95._8_4_ =
         fVar272 * (fVar327 * auVar287._8_4_ + fVar272 * auVar77._8_4_) + auVar287._8_4_ * fVar214;
    auVar95._12_4_ =
         fVar273 * (auVar106._12_4_ * auVar287._12_4_ + fVar273 * fVar211) +
         auVar287._12_4_ * fVar233;
    auVar95._16_4_ =
         fVar274 * (fVar308 * auVar287._16_4_ + fVar274 * auVar77._0_4_) + auVar287._16_4_ * fVar168
    ;
    auVar95._20_4_ =
         fVar275 * (fVar309 * auVar287._20_4_ + fVar275 * auVar77._4_4_) + auVar287._20_4_ * fVar186
    ;
    auVar95._24_4_ =
         fVar276 * (fVar327 * auVar287._24_4_ + fVar276 * auVar77._8_4_) + auVar287._24_4_ * fVar187
    ;
    auVar95._28_4_ = local_358._28_4_ + fVar211 + fVar230;
    auVar128._0_4_ =
         fVar262 * (fVar188 * auVar287._0_4_ + auVar86._0_4_ * fVar262) + auVar287._0_4_ * fVar189;
    auVar128._4_4_ =
         fVar271 * (fVar190 * auVar287._4_4_ + auVar86._4_4_ * fVar271) + auVar287._4_4_ * fVar191;
    auVar128._8_4_ =
         fVar272 * (fVar298 * auVar287._8_4_ + auVar86._8_4_ * fVar272) + auVar287._8_4_ * fVar259;
    auVar128._12_4_ =
         fVar273 * (fVar304 * auVar287._12_4_ + auVar86._12_4_ * fVar273) +
         auVar287._12_4_ * fVar260;
    auVar128._16_4_ =
         fVar274 * (fVar188 * auVar287._16_4_ + auVar86._0_4_ * fVar274) + auVar287._16_4_ * fVar305
    ;
    auVar128._20_4_ =
         fVar275 * (fVar190 * auVar287._20_4_ + auVar86._4_4_ * fVar275) + auVar287._20_4_ * fVar261
    ;
    auVar128._24_4_ =
         fVar276 * (fVar298 * auVar287._24_4_ + auVar86._8_4_ * fVar276) + auVar287._24_4_ * fVar306
    ;
    auVar128._28_4_ = fVar211 + auVar89._28_4_ + fVar230;
    auVar89 = vperm2f128_avx(local_b8,local_b8,1);
    auVar89 = vshufps_avx(auVar89,local_b8,0x30);
    _local_2d8 = vshufps_avx(local_b8,auVar89,0x29);
    auVar207._0_4_ =
         auVar287._0_4_ * (auVar150._0_4_ * auVar287._0_4_ + fVar262 * fVar192) + fVar262 * fVar213;
    auVar207._4_4_ =
         auVar287._4_4_ * (auVar150._4_4_ * auVar287._4_4_ + fVar271 * fVar209) + fVar271 * fVar232;
    auVar207._8_4_ =
         auVar287._8_4_ * (auVar150._8_4_ * auVar287._8_4_ + fVar272 * fVar210) + fVar272 * fVar214;
    auVar207._12_4_ =
         auVar287._12_4_ * (auVar150._12_4_ * auVar287._12_4_ + fVar273 * fVar229) +
         fVar273 * fVar233;
    auVar207._16_4_ =
         auVar287._16_4_ * (auVar150._0_4_ * auVar287._16_4_ + fVar274 * fVar192) +
         fVar274 * fVar168;
    auVar207._20_4_ =
         auVar287._20_4_ * (auVar150._4_4_ * auVar287._20_4_ + fVar275 * fVar209) +
         fVar275 * fVar186;
    auVar207._24_4_ =
         auVar287._24_4_ * (auVar150._8_4_ * auVar287._24_4_ + fVar276 * fVar210) +
         fVar276 * fVar187;
    auVar207._28_4_ = fVar307 + fVar316 + auVar206._28_4_;
    auVar257._0_4_ =
         fVar262 * fVar189 + auVar287._0_4_ * (auVar287._0_4_ * auVar20._0_4_ + fVar262 * fVar215);
    auVar257._4_4_ =
         fVar271 * fVar191 + auVar287._4_4_ * (auVar287._4_4_ * auVar20._4_4_ + fVar271 * fVar227);
    auVar257._8_4_ =
         fVar272 * fVar259 + auVar287._8_4_ * (auVar287._8_4_ * auVar20._8_4_ + fVar272 * fVar228);
    auVar257._12_4_ =
         fVar273 * fVar260 + auVar287._12_4_ * (auVar287._12_4_ * fVar230 + fVar273 * fVar212);
    auVar257._16_4_ =
         fVar274 * fVar305 + auVar287._16_4_ * (auVar287._16_4_ * auVar20._0_4_ + fVar274 * fVar215)
    ;
    auVar257._20_4_ =
         fVar275 * fVar261 + auVar287._20_4_ * (auVar287._20_4_ * auVar20._4_4_ + fVar275 * fVar227)
    ;
    auVar257._24_4_ =
         fVar276 * fVar306 + auVar287._24_4_ * (auVar287._24_4_ * auVar20._8_4_ + fVar276 * fVar228)
    ;
    auVar257._28_4_ = fVar316 + fVar304 + fVar230 + fVar212;
    auVar246._0_4_ = fVar262 * auVar95._0_4_ + auVar287._0_4_ * auVar207._0_4_;
    auVar246._4_4_ = fVar271 * auVar95._4_4_ + auVar287._4_4_ * auVar207._4_4_;
    auVar246._8_4_ = fVar272 * auVar95._8_4_ + auVar287._8_4_ * auVar207._8_4_;
    auVar246._12_4_ = fVar273 * auVar95._12_4_ + auVar287._12_4_ * auVar207._12_4_;
    auVar246._16_4_ = fVar274 * auVar95._16_4_ + auVar287._16_4_ * auVar207._16_4_;
    auVar246._20_4_ = fVar275 * auVar95._20_4_ + auVar287._20_4_ * auVar207._20_4_;
    auVar246._24_4_ = fVar276 * auVar95._24_4_ + auVar287._24_4_ * auVar207._24_4_;
    auVar246._28_4_ = fVar307 + fVar230 + fVar212;
    auVar269._0_4_ = fVar262 * auVar128._0_4_ + auVar287._0_4_ * auVar257._0_4_;
    auVar269._4_4_ = fVar271 * auVar128._4_4_ + auVar287._4_4_ * auVar257._4_4_;
    auVar269._8_4_ = fVar272 * auVar128._8_4_ + auVar287._8_4_ * auVar257._8_4_;
    auVar269._12_4_ = fVar273 * auVar128._12_4_ + auVar287._12_4_ * auVar257._12_4_;
    auVar269._16_4_ = fVar274 * auVar128._16_4_ + auVar287._16_4_ * auVar257._16_4_;
    auVar269._20_4_ = fVar275 * auVar128._20_4_ + auVar287._20_4_ * auVar257._20_4_;
    auVar269._24_4_ = fVar276 * auVar128._24_4_ + auVar287._24_4_ * auVar257._24_4_;
    auVar269._28_4_ = auVar12._28_4_ + auVar287._28_4_;
    auVar12 = vsubps_avx(auVar207,auVar95);
    auVar89 = vsubps_avx(auVar257,auVar128);
    local_138 = (float)local_378._0_4_ * auVar12._0_4_ * 3.0;
    fStack_134 = (float)local_378._4_4_ * auVar12._4_4_ * 3.0;
    auVar25._4_4_ = fStack_134;
    auVar25._0_4_ = local_138;
    fStack_130 = fStack_370 * auVar12._8_4_ * 3.0;
    auVar25._8_4_ = fStack_130;
    fStack_12c = fStack_36c * auVar12._12_4_ * 3.0;
    auVar25._12_4_ = fStack_12c;
    fStack_128 = (float)local_378._0_4_ * auVar12._16_4_ * 3.0;
    auVar25._16_4_ = fStack_128;
    fStack_124 = (float)local_378._4_4_ * auVar12._20_4_ * 3.0;
    auVar25._20_4_ = fStack_124;
    fStack_120 = fStack_370 * auVar12._24_4_ * 3.0;
    auVar25._24_4_ = fStack_120;
    auVar25._28_4_ = auVar12._28_4_;
    local_158 = (float)local_378._0_4_ * auVar89._0_4_ * 3.0;
    fStack_154 = (float)local_378._4_4_ * auVar89._4_4_ * 3.0;
    auVar26._4_4_ = fStack_154;
    auVar26._0_4_ = local_158;
    fStack_150 = fStack_370 * auVar89._8_4_ * 3.0;
    auVar26._8_4_ = fStack_150;
    fStack_14c = fStack_36c * auVar89._12_4_ * 3.0;
    auVar26._12_4_ = fStack_14c;
    fStack_148 = (float)local_378._0_4_ * auVar89._16_4_ * 3.0;
    auVar26._16_4_ = fStack_148;
    fStack_144 = (float)local_378._4_4_ * auVar89._20_4_ * 3.0;
    auVar26._20_4_ = fStack_144;
    fStack_140 = fStack_370 * auVar89._24_4_ * 3.0;
    auVar26._24_4_ = fStack_140;
    auVar26._28_4_ = auVar207._28_4_;
    auVar89 = vperm2f128_avx(auVar246,auVar246,1);
    auVar89 = vshufps_avx(auVar89,auVar246,0x30);
    auVar16 = vshufps_avx(auVar246,auVar89,0x29);
    auVar14 = vsubps_avx(auVar246,auVar25);
    auVar89 = vperm2f128_avx(auVar14,auVar14,1);
    auVar89 = vshufps_avx(auVar89,auVar14,0x30);
    _local_378 = vshufps_avx(auVar14,auVar89,0x29);
    auVar124 = _local_378;
    auVar14 = vsubps_avx(auVar269,auVar26);
    auVar89 = vperm2f128_avx(auVar14,auVar14,1);
    auVar89 = vshufps_avx(auVar89,auVar14,0x30);
    _local_428 = vshufps_avx(auVar14,auVar89,0x29);
    auVar14 = vsubps_avx(auVar246,local_b8);
    auVar15 = vsubps_avx(auVar16,_local_2d8);
    fVar192 = auVar15._0_4_ + auVar14._0_4_;
    fVar215 = auVar15._4_4_ + auVar14._4_4_;
    fVar209 = auVar15._8_4_ + auVar14._8_4_;
    fVar227 = auVar15._12_4_ + auVar14._12_4_;
    fVar210 = auVar15._16_4_ + auVar14._16_4_;
    fVar228 = auVar15._20_4_ + auVar14._20_4_;
    fVar211 = auVar15._24_4_ + auVar14._24_4_;
    auVar89 = vperm2f128_avx(auVar167,auVar167,1);
    auVar89 = vshufps_avx(auVar89,auVar167,0x30);
    local_d8 = vshufps_avx(auVar167,auVar89,0x29);
    auVar89 = vperm2f128_avx(auVar269,auVar269,1);
    auVar89 = vshufps_avx(auVar89,auVar269,0x30);
    local_98 = vshufps_avx(auVar269,auVar89,0x29);
    auVar89 = vsubps_avx(auVar269,auVar167);
    auVar17 = vsubps_avx(local_98,local_d8);
    fVar229 = auVar17._0_4_ + auVar89._0_4_;
    fVar212 = auVar17._4_4_ + auVar89._4_4_;
    fVar230 = auVar17._8_4_ + auVar89._8_4_;
    fVar213 = auVar17._12_4_ + auVar89._12_4_;
    fVar232 = auVar17._16_4_ + auVar89._16_4_;
    fVar214 = auVar17._20_4_ + auVar89._20_4_;
    fVar233 = auVar17._24_4_ + auVar89._24_4_;
    auVar27._4_4_ = fVar215 * auVar167._4_4_;
    auVar27._0_4_ = fVar192 * auVar167._0_4_;
    auVar27._8_4_ = fVar209 * auVar167._8_4_;
    auVar27._12_4_ = fVar227 * auVar167._12_4_;
    auVar27._16_4_ = fVar210 * auVar167._16_4_;
    auVar27._20_4_ = fVar228 * auVar167._20_4_;
    auVar27._24_4_ = fVar211 * auVar167._24_4_;
    auVar27._28_4_ = auVar89._28_4_;
    auVar28._4_4_ = fVar212 * local_b8._4_4_;
    auVar28._0_4_ = fVar229 * local_b8._0_4_;
    auVar28._8_4_ = fVar230 * local_b8._8_4_;
    auVar28._12_4_ = fVar213 * local_b8._12_4_;
    auVar28._16_4_ = fVar232 * local_b8._16_4_;
    auVar28._20_4_ = fVar214 * local_b8._20_4_;
    auVar28._24_4_ = fVar233 * local_b8._24_4_;
    auVar28._28_4_ = fVar307;
    auVar18 = vsubps_avx(auVar27,auVar28);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar13._28_4_;
    local_118 = local_118 + auVar167._0_4_;
    fStack_114 = fStack_114 + auVar167._4_4_;
    fStack_110 = fStack_110 + auVar167._8_4_;
    fStack_10c = fStack_10c + auVar167._12_4_;
    fStack_108 = fStack_108 + auVar167._16_4_;
    fStack_104 = fStack_104 + auVar167._20_4_;
    fStack_100 = fStack_100 + auVar167._24_4_;
    fStack_fc = fVar310 + auVar167._28_4_;
    auVar29._4_4_ = fVar215 * fStack_114;
    auVar29._0_4_ = fVar192 * local_118;
    auVar29._8_4_ = fVar209 * fStack_110;
    auVar29._12_4_ = fVar227 * fStack_10c;
    auVar29._16_4_ = fVar210 * fStack_108;
    auVar29._20_4_ = fVar228 * fStack_104;
    auVar29._24_4_ = fVar211 * fStack_100;
    auVar29._28_4_ = fVar310;
    auVar30._4_4_ = fVar212 * fStack_f4;
    auVar30._0_4_ = fVar229 * local_f8;
    auVar30._8_4_ = fVar230 * fStack_f0;
    auVar30._12_4_ = fVar213 * fStack_ec;
    auVar30._16_4_ = fVar232 * fStack_e8;
    auVar30._20_4_ = fVar214 * fStack_e4;
    auVar30._24_4_ = fVar233 * fStack_e0;
    auVar30._28_4_ = fVar310 + auVar167._28_4_;
    auVar13 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = fVar215 * (float)local_358._4_4_;
    auVar31._0_4_ = fVar192 * (float)local_358._0_4_;
    auVar31._8_4_ = fVar209 * fStack_350;
    auVar31._12_4_ = fVar227 * fStack_34c;
    auVar31._16_4_ = fVar210 * fStack_348;
    auVar31._20_4_ = fVar228 * fStack_344;
    auVar31._24_4_ = fVar211 * fStack_340;
    auVar31._28_4_ = fVar310;
    auVar32._4_4_ = fVar212 * (float)local_308._4_4_;
    auVar32._0_4_ = fVar229 * (float)local_308._0_4_;
    auVar32._8_4_ = fVar230 * fStack_300;
    auVar32._12_4_ = fVar213 * fStack_2fc;
    auVar32._16_4_ = fVar232 * fStack_2f8;
    auVar32._20_4_ = fVar214 * fStack_2f4;
    auVar32._24_4_ = fVar233 * fStack_2f0;
    auVar32._28_4_ = local_b8._28_4_;
    auVar19 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_d8._4_4_ * fVar215;
    auVar33._0_4_ = local_d8._0_4_ * fVar192;
    auVar33._8_4_ = local_d8._8_4_ * fVar209;
    auVar33._12_4_ = local_d8._12_4_ * fVar227;
    auVar33._16_4_ = local_d8._16_4_ * fVar210;
    auVar33._20_4_ = local_d8._20_4_ * fVar228;
    auVar33._24_4_ = local_d8._24_4_ * fVar211;
    auVar33._28_4_ = fVar310;
    auVar34._4_4_ = local_2d8._4_4_ * fVar212;
    auVar34._0_4_ = local_2d8._0_4_ * fVar229;
    auVar34._8_4_ = local_2d8._8_4_ * fVar230;
    auVar34._12_4_ = local_2d8._12_4_ * fVar213;
    auVar34._16_4_ = local_2d8._16_4_ * fVar232;
    auVar34._20_4_ = local_2d8._20_4_ * fVar214;
    auVar34._24_4_ = local_2d8._24_4_ * fVar233;
    auVar34._28_4_ = local_d8._28_4_;
    auVar21 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar269._4_4_ * fVar215;
    auVar35._0_4_ = auVar269._0_4_ * fVar192;
    auVar35._8_4_ = auVar269._8_4_ * fVar209;
    auVar35._12_4_ = auVar269._12_4_ * fVar227;
    auVar35._16_4_ = auVar269._16_4_ * fVar210;
    auVar35._20_4_ = auVar269._20_4_ * fVar228;
    auVar35._24_4_ = auVar269._24_4_ * fVar211;
    auVar35._28_4_ = fVar310;
    auVar36._4_4_ = fVar212 * auVar246._4_4_;
    auVar36._0_4_ = fVar229 * auVar246._0_4_;
    auVar36._8_4_ = fVar230 * auVar246._8_4_;
    auVar36._12_4_ = fVar213 * auVar246._12_4_;
    auVar36._16_4_ = fVar232 * auVar246._16_4_;
    auVar36._20_4_ = fVar214 * auVar246._20_4_;
    auVar36._24_4_ = fVar233 * auVar246._24_4_;
    auVar36._28_4_ = fStack_dc;
    auVar22 = vsubps_avx(auVar35,auVar36);
    local_138 = auVar246._0_4_ + local_138;
    fStack_134 = auVar246._4_4_ + fStack_134;
    fStack_130 = auVar246._8_4_ + fStack_130;
    fStack_12c = auVar246._12_4_ + fStack_12c;
    fStack_128 = auVar246._16_4_ + fStack_128;
    fStack_124 = auVar246._20_4_ + fStack_124;
    fStack_120 = auVar246._24_4_ + fStack_120;
    fStack_11c = auVar246._28_4_ + auVar12._28_4_;
    local_158 = auVar269._0_4_ + local_158;
    fStack_154 = auVar269._4_4_ + fStack_154;
    fStack_150 = auVar269._8_4_ + fStack_150;
    fStack_14c = auVar269._12_4_ + fStack_14c;
    fStack_148 = auVar269._16_4_ + fStack_148;
    fStack_144 = auVar269._20_4_ + fStack_144;
    fStack_140 = auVar269._24_4_ + fStack_140;
    fStack_13c = auVar269._28_4_ + auVar207._28_4_;
    auVar37._4_4_ = fVar215 * fStack_154;
    auVar37._0_4_ = fVar192 * local_158;
    auVar37._8_4_ = fVar209 * fStack_150;
    auVar37._12_4_ = fVar227 * fStack_14c;
    auVar37._16_4_ = fVar210 * fStack_148;
    auVar37._20_4_ = fVar228 * fStack_144;
    auVar37._24_4_ = fVar211 * fStack_140;
    auVar37._28_4_ = auVar269._28_4_ + auVar207._28_4_;
    auVar38._4_4_ = fStack_134 * fVar212;
    auVar38._0_4_ = local_138 * fVar229;
    auVar38._8_4_ = fStack_130 * fVar230;
    auVar38._12_4_ = fStack_12c * fVar213;
    auVar38._16_4_ = fStack_128 * fVar232;
    auVar38._20_4_ = fStack_124 * fVar214;
    auVar38._24_4_ = fStack_120 * fVar233;
    auVar38._28_4_ = fStack_11c;
    auVar90 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar215 * local_428._4_4_;
    auVar39._0_4_ = fVar192 * local_428._0_4_;
    auVar39._8_4_ = fVar209 * local_428._8_4_;
    auVar39._12_4_ = fVar227 * local_428._12_4_;
    auVar39._16_4_ = fVar210 * local_428._16_4_;
    auVar39._20_4_ = fVar228 * local_428._20_4_;
    auVar39._24_4_ = fVar211 * local_428._24_4_;
    auVar39._28_4_ = fStack_11c;
    auVar40._4_4_ = fVar212 * (float)local_378._4_4_;
    auVar40._0_4_ = fVar229 * (float)local_378._0_4_;
    auVar40._8_4_ = fVar230 * fStack_370;
    auVar40._12_4_ = fVar213 * fStack_36c;
    auVar40._16_4_ = fVar232 * fStack_368;
    auVar40._20_4_ = fVar214 * fStack_364;
    auVar40._24_4_ = fVar233 * fStack_360;
    auVar40._28_4_ = local_428._28_4_;
    auVar91 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar215 * local_98._4_4_;
    auVar41._0_4_ = fVar192 * local_98._0_4_;
    auVar41._8_4_ = fVar209 * local_98._8_4_;
    auVar41._12_4_ = fVar227 * local_98._12_4_;
    auVar41._16_4_ = fVar210 * local_98._16_4_;
    auVar41._20_4_ = fVar228 * local_98._20_4_;
    auVar41._24_4_ = fVar211 * local_98._24_4_;
    auVar41._28_4_ = auVar15._28_4_ + auVar14._28_4_;
    auVar42._4_4_ = auVar16._4_4_ * fVar212;
    auVar42._0_4_ = auVar16._0_4_ * fVar229;
    auVar42._8_4_ = auVar16._8_4_ * fVar230;
    auVar42._12_4_ = auVar16._12_4_ * fVar213;
    auVar42._16_4_ = auVar16._16_4_ * fVar232;
    auVar42._20_4_ = auVar16._20_4_ * fVar214;
    auVar42._24_4_ = auVar16._24_4_ * fVar233;
    auVar42._28_4_ = auVar17._28_4_ + auVar89._28_4_;
    auVar17 = vsubps_avx(auVar41,auVar42);
    auVar12 = vminps_avx(auVar18,auVar13);
    auVar89 = vmaxps_avx(auVar18,auVar13);
    auVar13 = vminps_avx(auVar19,auVar21);
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar19,auVar21);
    auVar89 = vmaxps_avx(auVar89,auVar12);
    auVar14 = vminps_avx(auVar22,auVar90);
    auVar12 = vmaxps_avx(auVar22,auVar90);
    auVar15 = vminps_avx(auVar91,auVar17);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar15 = vminps_avx(auVar13,auVar15);
    auVar13 = vmaxps_avx(auVar91,auVar17);
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar89,auVar12);
    auVar89 = vcmpps_avx(auVar15,local_78,2);
    auVar12 = vcmpps_avx(auVar12,local_1d8,5);
    auVar89 = vandps_avx(auVar12,auVar89);
    auVar12 = local_178 & auVar89;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(_local_2d8,local_b8);
      auVar13 = vsubps_avx(auVar16,auVar246);
      fVar215 = auVar12._0_4_ + auVar13._0_4_;
      fVar209 = auVar12._4_4_ + auVar13._4_4_;
      fVar227 = auVar12._8_4_ + auVar13._8_4_;
      fVar210 = auVar12._12_4_ + auVar13._12_4_;
      fVar228 = auVar12._16_4_ + auVar13._16_4_;
      fVar211 = auVar12._20_4_ + auVar13._20_4_;
      fVar229 = auVar12._24_4_ + auVar13._24_4_;
      auVar15 = vsubps_avx(local_d8,auVar167);
      auVar17 = vsubps_avx(local_98,auVar269);
      fVar212 = auVar15._0_4_ + auVar17._0_4_;
      fVar230 = auVar15._4_4_ + auVar17._4_4_;
      fVar213 = auVar15._8_4_ + auVar17._8_4_;
      fVar232 = auVar15._12_4_ + auVar17._12_4_;
      fVar214 = auVar15._16_4_ + auVar17._16_4_;
      fVar233 = auVar15._20_4_ + auVar17._20_4_;
      fVar168 = auVar15._24_4_ + auVar17._24_4_;
      fVar192 = auVar17._28_4_;
      auVar43._4_4_ = auVar167._4_4_ * fVar209;
      auVar43._0_4_ = auVar167._0_4_ * fVar215;
      auVar43._8_4_ = auVar167._8_4_ * fVar227;
      auVar43._12_4_ = auVar167._12_4_ * fVar210;
      auVar43._16_4_ = auVar167._16_4_ * fVar228;
      auVar43._20_4_ = auVar167._20_4_ * fVar211;
      auVar43._24_4_ = auVar167._24_4_ * fVar229;
      auVar43._28_4_ = auVar167._28_4_;
      auVar44._4_4_ = local_b8._4_4_ * fVar230;
      auVar44._0_4_ = local_b8._0_4_ * fVar212;
      auVar44._8_4_ = local_b8._8_4_ * fVar213;
      auVar44._12_4_ = local_b8._12_4_ * fVar232;
      auVar44._16_4_ = local_b8._16_4_ * fVar214;
      auVar44._20_4_ = local_b8._20_4_ * fVar233;
      auVar44._24_4_ = local_b8._24_4_ * fVar168;
      auVar44._28_4_ = local_b8._28_4_;
      auVar17 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar209 * fStack_114;
      auVar45._0_4_ = fVar215 * local_118;
      auVar45._8_4_ = fVar227 * fStack_110;
      auVar45._12_4_ = fVar210 * fStack_10c;
      auVar45._16_4_ = fVar228 * fStack_108;
      auVar45._20_4_ = fVar211 * fStack_104;
      auVar45._24_4_ = fVar229 * fStack_100;
      auVar45._28_4_ = auVar167._28_4_;
      auVar46._4_4_ = fVar230 * fStack_f4;
      auVar46._0_4_ = fVar212 * local_f8;
      auVar46._8_4_ = fVar213 * fStack_f0;
      auVar46._12_4_ = fVar232 * fStack_ec;
      auVar46._16_4_ = fVar214 * fStack_e8;
      auVar46._20_4_ = fVar233 * fStack_e4;
      auVar46._24_4_ = fVar168 * fStack_e0;
      auVar46._28_4_ = fVar192;
      auVar18 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar209 * (float)local_358._4_4_;
      auVar47._0_4_ = fVar215 * (float)local_358._0_4_;
      auVar47._8_4_ = fVar227 * fStack_350;
      auVar47._12_4_ = fVar210 * fStack_34c;
      auVar47._16_4_ = fVar228 * fStack_348;
      auVar47._20_4_ = fVar211 * fStack_344;
      auVar47._24_4_ = fVar229 * fStack_340;
      auVar47._28_4_ = fVar192;
      auVar48._4_4_ = fVar230 * (float)local_308._4_4_;
      auVar48._0_4_ = fVar212 * (float)local_308._0_4_;
      auVar48._8_4_ = fVar213 * fStack_300;
      auVar48._12_4_ = fVar232 * fStack_2fc;
      auVar48._16_4_ = fVar214 * fStack_2f8;
      auVar48._20_4_ = fVar233 * fStack_2f4;
      auVar48._24_4_ = fVar168 * fStack_2f0;
      auVar48._28_4_ = auVar14._28_4_;
      auVar19 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = local_d8._4_4_ * fVar209;
      auVar49._0_4_ = local_d8._0_4_ * fVar215;
      auVar49._8_4_ = local_d8._8_4_ * fVar227;
      auVar49._12_4_ = local_d8._12_4_ * fVar210;
      auVar49._16_4_ = local_d8._16_4_ * fVar228;
      auVar49._20_4_ = local_d8._20_4_ * fVar211;
      auVar49._24_4_ = local_d8._24_4_ * fVar229;
      auVar49._28_4_ = auVar14._28_4_;
      auVar50._4_4_ = local_2d8._4_4_ * fVar230;
      auVar50._0_4_ = local_2d8._0_4_ * fVar212;
      auVar50._8_4_ = local_2d8._8_4_ * fVar213;
      auVar50._12_4_ = local_2d8._12_4_ * fVar232;
      auVar50._16_4_ = local_2d8._16_4_ * fVar214;
      auVar50._20_4_ = local_2d8._20_4_ * fVar233;
      uVar2 = local_2d8._28_4_;
      auVar50._24_4_ = local_2d8._24_4_ * fVar168;
      auVar50._28_4_ = uVar2;
      auVar21 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar269._4_4_ * fVar209;
      auVar51._0_4_ = auVar269._0_4_ * fVar215;
      auVar51._8_4_ = auVar269._8_4_ * fVar227;
      auVar51._12_4_ = auVar269._12_4_ * fVar210;
      auVar51._16_4_ = auVar269._16_4_ * fVar228;
      auVar51._20_4_ = auVar269._20_4_ * fVar211;
      auVar51._24_4_ = auVar269._24_4_ * fVar229;
      auVar51._28_4_ = uVar2;
      auVar52._4_4_ = auVar246._4_4_ * fVar230;
      auVar52._0_4_ = auVar246._0_4_ * fVar212;
      auVar52._8_4_ = auVar246._8_4_ * fVar213;
      auVar52._12_4_ = auVar246._12_4_ * fVar232;
      auVar52._16_4_ = auVar246._16_4_ * fVar214;
      auVar52._20_4_ = auVar246._20_4_ * fVar233;
      auVar52._24_4_ = auVar246._24_4_ * fVar168;
      auVar52._28_4_ = auVar246._28_4_;
      auVar22 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar209 * fStack_154;
      auVar53._0_4_ = fVar215 * local_158;
      auVar53._8_4_ = fVar227 * fStack_150;
      auVar53._12_4_ = fVar210 * fStack_14c;
      auVar53._16_4_ = fVar228 * fStack_148;
      auVar53._20_4_ = fVar211 * fStack_144;
      auVar53._24_4_ = fVar229 * fStack_140;
      auVar53._28_4_ = uVar2;
      auVar54._4_4_ = fVar230 * fStack_134;
      auVar54._0_4_ = fVar212 * local_138;
      auVar54._8_4_ = fVar213 * fStack_130;
      auVar54._12_4_ = fVar232 * fStack_12c;
      auVar54._16_4_ = fVar214 * fStack_128;
      auVar54._20_4_ = fVar233 * fStack_124;
      auVar54._24_4_ = fVar168 * fStack_120;
      auVar54._28_4_ = auVar269._28_4_;
      auVar90 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar209 * local_428._4_4_;
      auVar55._0_4_ = fVar215 * local_428._0_4_;
      auVar55._8_4_ = fVar227 * local_428._8_4_;
      auVar55._12_4_ = fVar210 * local_428._12_4_;
      auVar55._16_4_ = fVar228 * local_428._16_4_;
      auVar55._20_4_ = fVar211 * local_428._20_4_;
      auVar55._24_4_ = fVar229 * local_428._24_4_;
      auVar55._28_4_ = auVar269._28_4_;
      auVar56._4_4_ = (float)local_378._4_4_ * fVar230;
      auVar56._0_4_ = (float)local_378._0_4_ * fVar212;
      auVar56._8_4_ = fStack_370 * fVar213;
      auVar56._12_4_ = fStack_36c * fVar232;
      auVar56._16_4_ = fStack_368 * fVar214;
      auVar56._20_4_ = fStack_364 * fVar233;
      auVar56._24_4_ = fStack_360 * fVar168;
      auVar56._28_4_ = local_d8._28_4_;
      auVar91 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = local_98._4_4_ * fVar209;
      auVar57._0_4_ = local_98._0_4_ * fVar215;
      auVar57._8_4_ = local_98._8_4_ * fVar227;
      auVar57._12_4_ = local_98._12_4_ * fVar210;
      auVar57._16_4_ = local_98._16_4_ * fVar228;
      auVar57._20_4_ = local_98._20_4_ * fVar211;
      auVar57._24_4_ = local_98._24_4_ * fVar229;
      auVar57._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar58._4_4_ = auVar16._4_4_ * fVar230;
      auVar58._0_4_ = auVar16._0_4_ * fVar212;
      auVar58._8_4_ = auVar16._8_4_ * fVar213;
      auVar58._12_4_ = auVar16._12_4_ * fVar232;
      auVar58._16_4_ = auVar16._16_4_ * fVar214;
      auVar58._20_4_ = auVar16._20_4_ * fVar233;
      auVar58._24_4_ = auVar16._24_4_ * fVar168;
      auVar58._28_4_ = auVar15._28_4_ + fVar192;
      auVar126 = vsubps_avx(auVar57,auVar58);
      auVar13 = vminps_avx(auVar17,auVar18);
      auVar12 = vmaxps_avx(auVar17,auVar18);
      auVar14 = vminps_avx(auVar19,auVar21);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar19,auVar21);
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar15 = vminps_avx(auVar22,auVar90);
      auVar13 = vmaxps_avx(auVar22,auVar90);
      auVar16 = vminps_avx(auVar91,auVar126);
      auVar15 = vminps_avx(auVar15,auVar16);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar91,auVar126);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar15,local_78,2);
      auVar13 = vcmpps_avx(auVar13,local_1d8,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar89 = vandps_avx(local_178,auVar89);
      auVar13 = auVar89 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar12,auVar89);
        uVar64 = vmovmskps_avx(auVar89);
        if (uVar64 != 0) {
          uVar62 = (ulong)uVar68;
          auStack_2b8[uVar62] = uVar64 & 0xff;
          uVar3 = vmovlps_avx(local_238);
          *(undefined8 *)(afStack_1b8 + uVar62 * 2) = uVar3;
          uVar66 = vmovlps_avx(auVar252);
          auStack_58[uVar62] = uVar66;
          uVar68 = uVar68 + 1;
        }
      }
    }
    _local_378 = auVar124;
    _local_358 = auVar125;
    if (uVar68 != 0) {
      do {
        auVar303 = ZEXT1664(local_498);
        auVar288 = ZEXT1664(local_478);
        auVar270 = ZEXT1664(local_468);
        auVar258 = ZEXT1664(local_458);
        auVar247 = ZEXT1664(local_448);
        uVar62 = (ulong)(uVar68 - 1);
        uVar64 = auStack_2b8[uVar62];
        fVar192 = afStack_1b8[uVar62 * 2];
        fVar215 = afStack_1b8[uVar62 * 2 + 1];
        auVar312._8_8_ = 0;
        auVar312._0_8_ = auStack_58[uVar62];
        auVar315 = ZEXT1664(auVar312);
        uVar66 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
          }
        }
        uVar64 = uVar64 - 1 & uVar64;
        auStack_2b8[uVar62] = uVar64;
        if (uVar64 == 0) {
          uVar68 = uVar68 - 1;
        }
        auVar226 = ZEXT1664(local_388);
        fVar227 = (float)(uVar66 + 1) * 0.14285715;
        fVar209 = (1.0 - (float)uVar66 * 0.14285715) * fVar192 +
                  fVar215 * (float)uVar66 * 0.14285715;
        fVar192 = (1.0 - fVar227) * fVar192 + fVar215 * fVar227;
        fVar215 = fVar192 - fVar209;
        auVar150 = ZEXT416((uint)fVar192);
        if (0.16666667 <= fVar215) {
          auVar150 = vinsertps_avx(ZEXT416((uint)fVar209),auVar150,0x10);
          auVar208 = ZEXT1664(_local_398);
          auVar326 = ZEXT1664(local_488);
          auVar297 = ZEXT1664(auVar150);
          goto LAB_010319cb;
        }
        auVar77 = vshufps_avx(auVar312,auVar312,0x50);
        auVar104._8_4_ = 0x3f800000;
        auVar104._0_8_ = 0x3f8000003f800000;
        auVar104._12_4_ = 0x3f800000;
        auVar20 = vsubps_avx(auVar104,auVar77);
        fVar227 = auVar77._0_4_;
        fVar210 = auVar77._4_4_;
        fVar228 = auVar77._8_4_;
        fVar211 = auVar77._12_4_;
        fVar229 = auVar20._0_4_;
        fVar212 = auVar20._4_4_;
        fVar230 = auVar20._8_4_;
        fVar213 = auVar20._12_4_;
        auVar134._0_4_ = fVar227 * (float)local_398._0_4_ + fVar229 * local_388._0_4_;
        auVar134._4_4_ = fVar210 * (float)local_398._4_4_ + fVar212 * local_388._4_4_;
        auVar134._8_4_ = fVar228 * fStack_390 + fVar230 * local_388._8_4_;
        auVar134._12_4_ = fVar211 * fStack_38c + fVar213 * local_388._12_4_;
        auVar174._0_4_ = local_478._0_4_ * fVar227 + fVar229 * local_448._0_4_;
        auVar174._4_4_ = local_478._4_4_ * fVar210 + fVar212 * local_448._4_4_;
        auVar174._8_4_ = local_478._8_4_ * fVar228 + fVar230 * local_448._8_4_;
        auVar174._12_4_ = local_478._12_4_ * fVar211 + fVar213 * local_448._12_4_;
        auVar198._0_4_ = local_488._0_4_ * fVar227 + local_458._0_4_ * fVar229;
        auVar198._4_4_ = local_488._4_4_ * fVar210 + local_458._4_4_ * fVar212;
        auVar198._8_4_ = local_488._8_4_ * fVar228 + local_458._8_4_ * fVar230;
        auVar198._12_4_ = local_488._12_4_ * fVar211 + local_458._12_4_ * fVar213;
        auVar74._0_4_ = local_498._0_4_ * fVar227 + local_468._0_4_ * fVar229;
        auVar74._4_4_ = local_498._4_4_ * fVar210 + local_468._4_4_ * fVar212;
        auVar74._8_4_ = local_498._8_4_ * fVar228 + local_468._8_4_ * fVar230;
        auVar74._12_4_ = local_498._12_4_ * fVar211 + local_468._12_4_ * fVar213;
        auVar129._16_16_ = auVar134;
        auVar129._0_16_ = auVar134;
        auVar155._16_16_ = auVar174;
        auVar155._0_16_ = auVar174;
        auVar185._16_16_ = auVar198;
        auVar185._0_16_ = auVar198;
        _local_308 = ZEXT432((uint)fVar209);
        _local_358 = auVar150;
        auVar89 = ZEXT2032(CONCAT416(fVar192,ZEXT416((uint)fVar209)));
        auVar89 = vshufps_avx(auVar89,auVar89,0);
        auVar12 = vsubps_avx(auVar155,auVar129);
        fVar227 = auVar89._0_4_;
        fVar210 = auVar89._4_4_;
        fVar228 = auVar89._8_4_;
        fVar211 = auVar89._12_4_;
        fVar229 = auVar89._16_4_;
        fVar212 = auVar89._20_4_;
        fVar230 = auVar89._24_4_;
        auVar130._0_4_ = auVar134._0_4_ + auVar12._0_4_ * fVar227;
        auVar130._4_4_ = auVar134._4_4_ + auVar12._4_4_ * fVar210;
        auVar130._8_4_ = auVar134._8_4_ + auVar12._8_4_ * fVar228;
        auVar130._12_4_ = auVar134._12_4_ + auVar12._12_4_ * fVar211;
        auVar130._16_4_ = auVar134._0_4_ + auVar12._16_4_ * fVar229;
        auVar130._20_4_ = auVar134._4_4_ + auVar12._20_4_ * fVar212;
        auVar130._24_4_ = auVar134._8_4_ + auVar12._24_4_ * fVar230;
        auVar130._28_4_ = auVar134._12_4_ + auVar12._28_4_;
        auVar89 = vsubps_avx(auVar185,auVar155);
        auVar156._0_4_ = auVar174._0_4_ + auVar89._0_4_ * fVar227;
        auVar156._4_4_ = auVar174._4_4_ + auVar89._4_4_ * fVar210;
        auVar156._8_4_ = auVar174._8_4_ + auVar89._8_4_ * fVar228;
        auVar156._12_4_ = auVar174._12_4_ + auVar89._12_4_ * fVar211;
        auVar156._16_4_ = auVar174._0_4_ + auVar89._16_4_ * fVar229;
        auVar156._20_4_ = auVar174._4_4_ + auVar89._20_4_ * fVar212;
        auVar156._24_4_ = auVar174._8_4_ + auVar89._24_4_ * fVar230;
        auVar156._28_4_ = auVar174._12_4_ + auVar89._28_4_;
        auVar77 = vsubps_avx(auVar74,auVar198);
        auVar96._0_4_ = auVar198._0_4_ + auVar77._0_4_ * fVar227;
        auVar96._4_4_ = auVar198._4_4_ + auVar77._4_4_ * fVar210;
        auVar96._8_4_ = auVar198._8_4_ + auVar77._8_4_ * fVar228;
        auVar96._12_4_ = auVar198._12_4_ + auVar77._12_4_ * fVar211;
        auVar96._16_4_ = auVar198._0_4_ + auVar77._0_4_ * fVar229;
        auVar96._20_4_ = auVar198._4_4_ + auVar77._4_4_ * fVar212;
        auVar96._24_4_ = auVar198._8_4_ + auVar77._8_4_ * fVar230;
        auVar96._28_4_ = auVar198._12_4_ + auVar77._12_4_;
        auVar89 = vsubps_avx(auVar156,auVar130);
        auVar131._0_4_ = auVar130._0_4_ + fVar227 * auVar89._0_4_;
        auVar131._4_4_ = auVar130._4_4_ + fVar210 * auVar89._4_4_;
        auVar131._8_4_ = auVar130._8_4_ + fVar228 * auVar89._8_4_;
        auVar131._12_4_ = auVar130._12_4_ + fVar211 * auVar89._12_4_;
        auVar131._16_4_ = auVar130._16_4_ + fVar229 * auVar89._16_4_;
        auVar131._20_4_ = auVar130._20_4_ + fVar212 * auVar89._20_4_;
        auVar131._24_4_ = auVar130._24_4_ + fVar230 * auVar89._24_4_;
        auVar131._28_4_ = auVar130._28_4_ + auVar89._28_4_;
        auVar89 = vsubps_avx(auVar96,auVar156);
        auVar97._0_4_ = auVar156._0_4_ + fVar227 * auVar89._0_4_;
        auVar97._4_4_ = auVar156._4_4_ + fVar210 * auVar89._4_4_;
        auVar97._8_4_ = auVar156._8_4_ + fVar228 * auVar89._8_4_;
        auVar97._12_4_ = auVar156._12_4_ + fVar211 * auVar89._12_4_;
        auVar97._16_4_ = auVar156._16_4_ + fVar229 * auVar89._16_4_;
        auVar97._20_4_ = auVar156._20_4_ + fVar212 * auVar89._20_4_;
        auVar97._24_4_ = auVar156._24_4_ + fVar230 * auVar89._24_4_;
        auVar97._28_4_ = auVar156._28_4_ + auVar89._28_4_;
        auVar89 = vsubps_avx(auVar97,auVar131);
        auVar222._0_4_ = auVar131._0_4_ + fVar227 * auVar89._0_4_;
        auVar222._4_4_ = auVar131._4_4_ + fVar210 * auVar89._4_4_;
        auVar222._8_4_ = auVar131._8_4_ + fVar228 * auVar89._8_4_;
        auVar222._12_4_ = auVar131._12_4_ + fVar211 * auVar89._12_4_;
        auVar225._16_4_ = auVar131._16_4_ + fVar229 * auVar89._16_4_;
        auVar225._0_16_ = auVar222;
        auVar225._20_4_ = auVar131._20_4_ + fVar212 * auVar89._20_4_;
        auVar225._24_4_ = auVar131._24_4_ + fVar230 * auVar89._24_4_;
        auVar225._28_4_ = auVar131._28_4_ + auVar156._28_4_;
        auVar231 = auVar225._16_16_;
        auVar106 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.33333334)),
                               ZEXT416((uint)(fVar215 * 0.33333334)),0);
        auVar175._0_4_ = auVar222._0_4_ + auVar106._0_4_ * auVar89._0_4_ * 3.0;
        auVar175._4_4_ = auVar222._4_4_ + auVar106._4_4_ * auVar89._4_4_ * 3.0;
        auVar175._8_4_ = auVar222._8_4_ + auVar106._8_4_ * auVar89._8_4_ * 3.0;
        auVar175._12_4_ = auVar222._12_4_ + auVar106._12_4_ * auVar89._12_4_ * 3.0;
        auVar118 = vshufpd_avx(auVar222,auVar222,3);
        auVar86 = vshufpd_avx(auVar231,auVar231,3);
        _local_2d8 = auVar118;
        auVar77 = vsubps_avx(auVar118,auVar222);
        _local_428 = auVar86;
        auVar20 = vsubps_avx(auVar86,auVar231);
        auVar75._0_4_ = auVar77._0_4_ + auVar20._0_4_;
        auVar75._4_4_ = auVar77._4_4_ + auVar20._4_4_;
        auVar75._8_4_ = auVar77._8_4_ + auVar20._8_4_;
        auVar75._12_4_ = auVar77._12_4_ + auVar20._12_4_;
        auVar77 = vmovshdup_avx(auVar222);
        auVar20 = vmovshdup_avx(auVar175);
        auVar136 = vshufps_avx(auVar75,auVar75,0);
        auVar107 = vshufps_avx(auVar75,auVar75,0x55);
        fVar227 = auVar107._0_4_;
        fVar210 = auVar107._4_4_;
        fVar228 = auVar107._8_4_;
        fVar211 = auVar107._12_4_;
        fVar229 = auVar136._0_4_;
        fVar212 = auVar136._4_4_;
        fVar230 = auVar136._8_4_;
        fVar213 = auVar136._12_4_;
        auVar76._0_4_ = fVar229 * auVar222._0_4_ + auVar77._0_4_ * fVar227;
        auVar76._4_4_ = fVar212 * auVar222._4_4_ + auVar77._4_4_ * fVar210;
        auVar76._8_4_ = fVar230 * auVar222._8_4_ + auVar77._8_4_ * fVar228;
        auVar76._12_4_ = fVar213 * auVar222._12_4_ + auVar77._12_4_ * fVar211;
        _local_378 = auVar175;
        auVar290._0_4_ = fVar229 * auVar175._0_4_ + auVar20._0_4_ * fVar227;
        auVar290._4_4_ = fVar212 * auVar175._4_4_ + auVar20._4_4_ * fVar210;
        auVar290._8_4_ = fVar230 * auVar175._8_4_ + auVar20._8_4_ * fVar228;
        auVar290._12_4_ = fVar213 * auVar175._12_4_ + auVar20._12_4_ * fVar211;
        auVar20 = vshufps_avx(auVar76,auVar76,0xe8);
        auVar136 = vshufps_avx(auVar290,auVar290,0xe8);
        auVar77 = vcmpps_avx(auVar20,auVar136,1);
        uVar64 = vextractps_avx(auVar77,0);
        auVar107 = auVar290;
        if ((uVar64 & 1) == 0) {
          auVar107 = auVar76;
        }
        auVar105._0_4_ = auVar106._0_4_ * auVar89._16_4_ * 3.0;
        auVar105._4_4_ = auVar106._4_4_ * auVar89._20_4_ * 3.0;
        auVar105._8_4_ = auVar106._8_4_ * auVar89._24_4_ * 3.0;
        auVar105._12_4_ = auVar106._12_4_ * 0.0;
        auVar252 = vsubps_avx(auVar231,auVar105);
        auVar106 = vmovshdup_avx(auVar252);
        auVar231 = vmovshdup_avx(auVar231);
        fVar232 = auVar252._0_4_;
        fVar214 = auVar252._4_4_;
        auVar199._0_4_ = fVar232 * fVar229 + auVar106._0_4_ * fVar227;
        auVar199._4_4_ = fVar214 * fVar212 + auVar106._4_4_ * fVar210;
        auVar199._8_4_ = auVar252._8_4_ * fVar230 + auVar106._8_4_ * fVar228;
        auVar199._12_4_ = auVar252._12_4_ * fVar213 + auVar106._12_4_ * fVar211;
        auVar324._0_4_ = fVar229 * auVar225._16_4_ + auVar231._0_4_ * fVar227;
        auVar324._4_4_ = fVar212 * auVar225._20_4_ + auVar231._4_4_ * fVar210;
        auVar324._8_4_ = fVar230 * auVar225._24_4_ + auVar231._8_4_ * fVar228;
        auVar324._12_4_ = fVar213 * auVar225._28_4_ + auVar231._12_4_ * fVar211;
        auVar231 = vshufps_avx(auVar199,auVar199,0xe8);
        auVar5 = vshufps_avx(auVar324,auVar324,0xe8);
        auVar106 = vcmpps_avx(auVar231,auVar5,1);
        uVar64 = vextractps_avx(auVar106,0);
        auVar281 = auVar324;
        if ((uVar64 & 1) == 0) {
          auVar281 = auVar199;
        }
        auVar107 = vmaxss_avx(auVar281,auVar107);
        auVar20 = vminps_avx(auVar20,auVar136);
        auVar136 = vminps_avx(auVar231,auVar5);
        auVar136 = vminps_avx(auVar20,auVar136);
        auVar77 = vshufps_avx(auVar77,auVar77,0x55);
        auVar77 = vblendps_avx(auVar77,auVar106,2);
        auVar106 = vpslld_avx(auVar77,0x1f);
        auVar77 = vshufpd_avx(auVar290,auVar290,1);
        auVar77 = vinsertps_avx(auVar77,auVar324,0x9c);
        auVar20 = vshufpd_avx(auVar76,auVar76,1);
        auVar20 = vinsertps_avx(auVar20,auVar199,0x9c);
        auVar77 = vblendvps_avx(auVar20,auVar77,auVar106);
        auVar20 = vmovshdup_avx(auVar77);
        auVar77 = vmaxss_avx(auVar20,auVar77);
        fVar228 = auVar136._0_4_;
        auVar20 = vmovshdup_avx(auVar136);
        fVar210 = auVar77._0_4_;
        fVar211 = auVar20._0_4_;
        fVar227 = auVar107._0_4_;
        if ((0.0001 <= fVar228) || (fVar210 <= -0.0001)) {
          if ((fVar211 < 0.0001 && -0.0001 < fVar227) || (fVar228 < 0.0001 && -0.0001 < fVar227))
          goto LAB_010323d4;
          auVar106 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar77,1);
          auVar20 = vcmpps_avx(auVar20,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar20 = vandps_avx(auVar20,auVar106);
          if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_010323d4;
        }
        else {
LAB_010323d4:
          auVar106 = vcmpps_avx(auVar136,_DAT_01f7aa10,1);
          auVar20 = vcmpss_avx(auVar107,ZEXT416(0) << 0x20,1);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar176._8_4_ = 0xbf800000;
          auVar176._0_8_ = 0xbf800000bf800000;
          auVar176._12_4_ = 0xbf800000;
          auVar20 = vblendvps_avx(auVar135,auVar176,auVar20);
          auVar106 = vblendvps_avx(auVar135,auVar176,auVar106);
          auVar136 = vcmpss_avx(auVar106,auVar20,4);
          auVar136 = vpshufd_avx(ZEXT416(auVar136._0_4_ & 1),0x50);
          auVar136 = vpslld_avx(auVar136,0x1f);
          auVar136 = vpsrad_avx(auVar136,0x1f);
          auVar136 = vpandn_avx(auVar136,_DAT_01fafeb0);
          auVar107 = vmovshdup_avx(auVar106);
          fVar229 = auVar107._0_4_;
          if ((auVar106._0_4_ != fVar229) || (NAN(auVar106._0_4_) || NAN(fVar229))) {
            if ((fVar211 != fVar228) || (NAN(fVar211) || NAN(fVar228))) {
              fVar228 = -fVar228 / (fVar211 - fVar228);
              auVar106 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar228) * 0.0 + fVar228)));
            }
            else {
              auVar106 = ZEXT816(0x3f80000000000000);
              if ((fVar228 != 0.0) || (NAN(fVar228))) {
                auVar106 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar231 = vcmpps_avx(auVar136,auVar106,1);
            auVar107 = vblendps_avx(auVar136,auVar106,2);
            auVar106 = vblendps_avx(auVar106,auVar136,2);
            auVar136 = vblendvps_avx(auVar106,auVar107,auVar231);
          }
          auVar77 = vcmpss_avx(auVar77,ZEXT416(0) << 0x20,1);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar177._8_4_ = 0xbf800000;
          auVar177._0_8_ = 0xbf800000bf800000;
          auVar177._12_4_ = 0xbf800000;
          auVar77 = vblendvps_avx(auVar137,auVar177,auVar77);
          fVar228 = auVar77._0_4_;
          if ((auVar20._0_4_ != fVar228) || (NAN(auVar20._0_4_) || NAN(fVar228))) {
            if ((fVar210 != fVar227) || (NAN(fVar210) || NAN(fVar227))) {
              fVar227 = -fVar227 / (fVar210 - fVar227);
              auVar77 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar227) * 0.0 + fVar227)));
            }
            else {
              auVar77 = ZEXT816(0x3f80000000000000);
              if ((fVar227 != 0.0) || (NAN(fVar227))) {
                auVar77 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar106 = vcmpps_avx(auVar136,auVar77,1);
            auVar20 = vblendps_avx(auVar136,auVar77,2);
            auVar77 = vblendps_avx(auVar77,auVar136,2);
            auVar136 = vblendvps_avx(auVar77,auVar20,auVar106);
          }
          if ((fVar229 != fVar228) || (NAN(fVar229) || NAN(fVar228))) {
            auVar78._8_4_ = 0x3f800000;
            auVar78._0_8_ = 0x3f8000003f800000;
            auVar78._12_4_ = 0x3f800000;
            auVar77 = vcmpps_avx(auVar136,auVar78,1);
            auVar20 = vinsertps_avx(auVar136,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar138._4_12_ = auVar136._4_12_;
            auVar138._0_4_ = 0x3f800000;
            auVar136 = vblendvps_avx(auVar138,auVar20,auVar77);
          }
          auVar77 = vcmpps_avx(auVar136,_DAT_01f7b6f0,1);
          auVar60._12_4_ = 0;
          auVar60._0_12_ = auVar136._4_12_;
          auVar20 = vinsertps_avx(auVar136,ZEXT416(0x3f800000),0x10);
          auVar77 = vblendvps_avx(auVar20,auVar60 << 0x20,auVar77);
          auVar20 = vmovshdup_avx(auVar77);
          if (auVar77._0_4_ <= auVar20._0_4_) {
            auVar79._0_4_ = auVar77._0_4_ + -0.1;
            auVar79._4_4_ = auVar77._4_4_ + 0.1;
            auVar79._8_4_ = auVar77._8_4_ + 0.0;
            auVar79._12_4_ = auVar77._12_4_ + 0.0;
            auVar106 = vshufpd_avx(auVar175,auVar175,3);
            register0x00001388 = 0x3f80000000000000;
            local_378 = 0x3f80000000000000;
            auVar77 = vcmpps_avx(auVar79,_local_378,1);
            auVar59._12_4_ = 0;
            auVar59._0_12_ = auVar79._4_12_;
            auVar20 = vinsertps_avx(auVar79,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar77 = vblendvps_avx(auVar20,auVar59 << 0x20,auVar77);
            auVar20 = vshufpd_avx(auVar252,auVar252,3);
            auVar136 = vshufps_avx(auVar77,auVar77,0x50);
            auVar318._8_4_ = 0x3f800000;
            auVar318._0_8_ = 0x3f8000003f800000;
            auVar318._12_4_ = 0x3f800000;
            auVar107 = vsubps_avx(auVar318,auVar136);
            local_2d8._0_4_ = auVar118._0_4_;
            local_2d8._4_4_ = auVar118._4_4_;
            fStack_2d0 = auVar118._8_4_;
            fStack_2cc = auVar118._12_4_;
            fVar227 = auVar136._0_4_;
            fVar210 = auVar136._4_4_;
            fVar228 = auVar136._8_4_;
            fVar211 = auVar136._12_4_;
            local_428._0_4_ = auVar86._0_4_;
            local_428._4_4_ = auVar86._4_4_;
            fStack_420 = auVar86._8_4_;
            fStack_41c = auVar86._12_4_;
            fVar229 = auVar107._0_4_;
            fVar212 = auVar107._4_4_;
            fVar230 = auVar107._8_4_;
            fVar213 = auVar107._12_4_;
            auVar80._0_4_ = fVar227 * (float)local_2d8._0_4_ + fVar229 * auVar222._0_4_;
            auVar80._4_4_ = fVar210 * (float)local_2d8._4_4_ + fVar212 * auVar222._4_4_;
            auVar80._8_4_ = fVar228 * fStack_2d0 + fVar230 * auVar222._0_4_;
            auVar80._12_4_ = fVar211 * fStack_2cc + fVar213 * auVar222._4_4_;
            auVar200._0_4_ = auVar106._0_4_ * fVar227 + fVar229 * auVar175._0_4_;
            auVar200._4_4_ = auVar106._4_4_ * fVar210 + fVar212 * auVar175._4_4_;
            auVar200._8_4_ = auVar106._8_4_ * fVar228 + fVar230 * auVar175._0_4_;
            auVar200._12_4_ = auVar106._12_4_ * fVar211 + fVar213 * auVar175._4_4_;
            auVar238._0_4_ = auVar20._0_4_ * fVar227 + fVar229 * fVar232;
            auVar238._4_4_ = auVar20._4_4_ * fVar210 + fVar212 * fVar214;
            auVar238._8_4_ = auVar20._8_4_ * fVar228 + fVar230 * fVar232;
            auVar238._12_4_ = auVar20._12_4_ * fVar211 + fVar213 * fVar214;
            auVar282._0_4_ = fVar227 * (float)local_428._0_4_ + fVar229 * auVar225._16_4_;
            auVar282._4_4_ = fVar210 * (float)local_428._4_4_ + fVar212 * auVar225._20_4_;
            auVar282._8_4_ = fVar228 * fStack_420 + fVar230 * auVar225._16_4_;
            auVar282._12_4_ = fVar211 * fStack_41c + fVar213 * auVar225._20_4_;
            auVar86 = vsubps_avx(auVar318,auVar77);
            auVar20 = vmovshdup_avx(auVar312);
            auVar118 = vmovsldup_avx(auVar312);
            auVar325._0_4_ = auVar86._0_4_ * auVar118._0_4_ + auVar77._0_4_ * auVar20._0_4_;
            auVar325._4_4_ = auVar86._4_4_ * auVar118._4_4_ + auVar77._4_4_ * auVar20._4_4_;
            auVar325._8_4_ = auVar86._8_4_ * auVar118._8_4_ + auVar77._8_4_ * auVar20._8_4_;
            auVar325._12_4_ = auVar86._12_4_ * auVar118._12_4_ + auVar77._12_4_ * auVar20._12_4_;
            _local_428 = vmovshdup_avx(auVar325);
            auVar77 = vsubps_avx(auVar200,auVar80);
            auVar139._0_4_ = auVar77._0_4_ * 3.0;
            auVar139._4_4_ = auVar77._4_4_ * 3.0;
            auVar139._8_4_ = auVar77._8_4_ * 3.0;
            auVar139._12_4_ = auVar77._12_4_ * 3.0;
            auVar77 = vsubps_avx(auVar238,auVar200);
            auVar160._0_4_ = auVar77._0_4_ * 3.0;
            auVar160._4_4_ = auVar77._4_4_ * 3.0;
            auVar160._8_4_ = auVar77._8_4_ * 3.0;
            auVar160._12_4_ = auVar77._12_4_ * 3.0;
            auVar77 = vsubps_avx(auVar282,auVar238);
            auVar254._0_4_ = auVar77._0_4_ * 3.0;
            auVar254._4_4_ = auVar77._4_4_ * 3.0;
            auVar254._8_4_ = auVar77._8_4_ * 3.0;
            auVar254._12_4_ = auVar77._12_4_ * 3.0;
            auVar20 = vminps_avx(auVar160,auVar254);
            auVar77 = vmaxps_avx(auVar160,auVar254);
            auVar20 = vminps_avx(auVar139,auVar20);
            auVar77 = vmaxps_avx(auVar139,auVar77);
            auVar118 = vshufpd_avx(auVar20,auVar20,3);
            auVar86 = vshufpd_avx(auVar77,auVar77,3);
            auVar20 = vminps_avx(auVar20,auVar118);
            auVar77 = vmaxps_avx(auVar77,auVar86);
            auVar118 = vshufps_avx(ZEXT416((uint)(1.0 / fVar215)),ZEXT416((uint)(1.0 / fVar215)),0);
            auVar255._0_4_ = auVar118._0_4_ * auVar20._0_4_;
            auVar255._4_4_ = auVar118._4_4_ * auVar20._4_4_;
            auVar255._8_4_ = auVar118._8_4_ * auVar20._8_4_;
            auVar255._12_4_ = auVar118._12_4_ * auVar20._12_4_;
            auVar265._0_4_ = auVar118._0_4_ * auVar77._0_4_;
            auVar265._4_4_ = auVar118._4_4_ * auVar77._4_4_;
            auVar265._8_4_ = auVar118._8_4_ * auVar77._8_4_;
            auVar265._12_4_ = auVar118._12_4_ * auVar77._12_4_;
            auVar107 = ZEXT416((uint)(1.0 / (local_428._0_4_ - auVar325._0_4_)));
            auVar77 = vshufpd_avx(auVar80,auVar80,3);
            auVar20 = vshufpd_avx(auVar200,auVar200,3);
            auVar118 = vshufpd_avx(auVar238,auVar238,3);
            auVar86 = vshufpd_avx(auVar282,auVar282,3);
            auVar77 = vsubps_avx(auVar77,auVar80);
            auVar106 = vsubps_avx(auVar20,auVar200);
            auVar136 = vsubps_avx(auVar118,auVar238);
            auVar86 = vsubps_avx(auVar86,auVar282);
            auVar20 = vminps_avx(auVar77,auVar106);
            auVar77 = vmaxps_avx(auVar77,auVar106);
            auVar118 = vminps_avx(auVar136,auVar86);
            auVar118 = vminps_avx(auVar20,auVar118);
            auVar20 = vmaxps_avx(auVar136,auVar86);
            auVar77 = vmaxps_avx(auVar77,auVar20);
            auVar20 = vshufps_avx(auVar107,auVar107,0);
            auVar313._0_4_ = auVar20._0_4_ * auVar118._0_4_;
            auVar313._4_4_ = auVar20._4_4_ * auVar118._4_4_;
            auVar313._8_4_ = auVar20._8_4_ * auVar118._8_4_;
            auVar313._12_4_ = auVar20._12_4_ * auVar118._12_4_;
            auVar319._0_4_ = auVar20._0_4_ * auVar77._0_4_;
            auVar319._4_4_ = auVar20._4_4_ * auVar77._4_4_;
            auVar319._8_4_ = auVar20._8_4_ * auVar77._8_4_;
            auVar319._12_4_ = auVar20._12_4_ * auVar77._12_4_;
            auVar77 = vmovsldup_avx(auVar325);
            auVar283._4_12_ = auVar77._4_12_;
            auVar283._0_4_ = fVar209;
            auVar291._4_12_ = auVar325._4_12_;
            auVar291._0_4_ = fVar192;
            auVar161._0_4_ = (fVar209 + fVar192) * 0.5;
            auVar161._4_4_ = (auVar77._4_4_ + auVar325._4_4_) * 0.5;
            auVar161._8_4_ = (auVar77._8_4_ + auVar325._8_4_) * 0.5;
            auVar161._12_4_ = (auVar77._12_4_ + auVar325._12_4_) * 0.5;
            auVar77 = vshufps_avx(auVar161,auVar161,0);
            fVar227 = auVar77._0_4_;
            fVar210 = auVar77._4_4_;
            fVar228 = auVar77._8_4_;
            fVar211 = auVar77._12_4_;
            auVar108._0_4_ = fVar227 * (float)local_208._0_4_ + (float)local_4a8._0_4_;
            auVar108._4_4_ = fVar210 * (float)local_208._4_4_ + (float)local_4a8._4_4_;
            auVar108._8_4_ = fVar228 * fStack_200 + fStack_4a0;
            auVar108._12_4_ = fVar211 * fStack_1fc + fStack_49c;
            auVar140._0_4_ = fVar227 * (float)local_218._0_4_ + (float)local_4b8._0_4_;
            auVar140._4_4_ = fVar210 * (float)local_218._4_4_ + (float)local_4b8._4_4_;
            auVar140._8_4_ = fVar228 * fStack_210 + fStack_4b0;
            auVar140._12_4_ = fVar211 * fStack_20c + fStack_4ac;
            auVar201._0_4_ = fVar227 * (float)local_228._0_4_ + (float)local_4c8._0_4_;
            auVar201._4_4_ = fVar210 * (float)local_228._4_4_ + (float)local_4c8._4_4_;
            auVar201._8_4_ = fVar228 * fStack_220 + fStack_4c0;
            auVar201._12_4_ = fVar211 * fStack_21c + fStack_4bc;
            auVar77 = vsubps_avx(auVar140,auVar108);
            auVar109._0_4_ = auVar108._0_4_ + fVar227 * auVar77._0_4_;
            auVar109._4_4_ = auVar108._4_4_ + fVar210 * auVar77._4_4_;
            auVar109._8_4_ = auVar108._8_4_ + fVar228 * auVar77._8_4_;
            auVar109._12_4_ = auVar108._12_4_ + fVar211 * auVar77._12_4_;
            auVar77 = vsubps_avx(auVar201,auVar140);
            auVar141._0_4_ = auVar140._0_4_ + fVar227 * auVar77._0_4_;
            auVar141._4_4_ = auVar140._4_4_ + fVar210 * auVar77._4_4_;
            auVar141._8_4_ = auVar140._8_4_ + fVar228 * auVar77._8_4_;
            auVar141._12_4_ = auVar140._12_4_ + fVar211 * auVar77._12_4_;
            auVar77 = vsubps_avx(auVar141,auVar109);
            fVar227 = auVar109._0_4_ + fVar227 * auVar77._0_4_;
            fVar210 = auVar109._4_4_ + fVar210 * auVar77._4_4_;
            auVar81._0_8_ = CONCAT44(fVar210,fVar227);
            auVar81._8_4_ = auVar109._8_4_ + fVar228 * auVar77._8_4_;
            auVar81._12_4_ = auVar109._12_4_ + fVar211 * auVar77._12_4_;
            fVar228 = auVar77._0_4_ * 3.0;
            fVar211 = auVar77._4_4_ * 3.0;
            auVar110._0_8_ = CONCAT44(fVar211,fVar228);
            auVar110._8_4_ = auVar77._8_4_ * 3.0;
            auVar110._12_4_ = auVar77._12_4_ * 3.0;
            auVar142._8_8_ = auVar81._0_8_;
            auVar142._0_8_ = auVar81._0_8_;
            auVar77 = vshufpd_avx(auVar81,auVar81,3);
            auVar20 = vshufps_avx(auVar161,auVar161,0x55);
            auVar136 = vsubps_avx(auVar77,auVar142);
            auVar301._0_4_ = auVar136._0_4_ * auVar20._0_4_ + fVar227;
            auVar301._4_4_ = auVar136._4_4_ * auVar20._4_4_ + fVar210;
            auVar301._8_4_ = auVar136._8_4_ * auVar20._8_4_ + fVar227;
            auVar301._12_4_ = auVar136._12_4_ * auVar20._12_4_ + fVar210;
            auVar143._8_8_ = auVar110._0_8_;
            auVar143._0_8_ = auVar110._0_8_;
            auVar77 = vshufpd_avx(auVar110,auVar110,1);
            auVar77 = vsubps_avx(auVar77,auVar143);
            auVar111._0_4_ = auVar77._0_4_ * auVar20._0_4_ + fVar228;
            auVar111._4_4_ = auVar77._4_4_ * auVar20._4_4_ + fVar211;
            auVar111._8_4_ = auVar77._8_4_ * auVar20._8_4_ + fVar228;
            auVar111._12_4_ = auVar77._12_4_ * auVar20._12_4_ + fVar211;
            auVar20 = vmovshdup_avx(auVar111);
            auVar202._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
            auVar202._8_4_ = auVar20._8_4_ ^ 0x80000000;
            auVar202._12_4_ = auVar20._12_4_ ^ 0x80000000;
            auVar118 = vmovshdup_avx(auVar136);
            auVar77 = vunpcklps_avx(auVar118,auVar202);
            auVar86 = vshufps_avx(auVar77,auVar202,4);
            auVar82._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
            auVar82._8_4_ = -auVar136._8_4_;
            auVar82._12_4_ = -auVar136._12_4_;
            auVar77 = vmovlhps_avx(auVar82,auVar111);
            auVar106 = vshufps_avx(auVar77,auVar111,8);
            auVar77 = ZEXT416((uint)(auVar111._0_4_ * auVar118._0_4_ -
                                    auVar136._0_4_ * auVar20._0_4_));
            auVar20 = vshufps_avx(auVar77,auVar77,0);
            auVar77 = vdivps_avx(auVar86,auVar20);
            auVar20 = vdivps_avx(auVar106,auVar20);
            auVar106 = vinsertps_avx(auVar255,auVar313,0x1c);
            auVar136 = vinsertps_avx(auVar265,auVar319,0x1c);
            auVar107 = vinsertps_avx(auVar313,auVar255,0x4c);
            auVar231 = vinsertps_avx(auVar319,auVar265,0x4c);
            auVar118 = vmovsldup_avx(auVar77);
            auVar144._0_4_ = auVar118._0_4_ * auVar106._0_4_;
            auVar144._4_4_ = auVar118._4_4_ * auVar106._4_4_;
            auVar144._8_4_ = auVar118._8_4_ * auVar106._8_4_;
            auVar144._12_4_ = auVar118._12_4_ * auVar106._12_4_;
            auVar112._0_4_ = auVar136._0_4_ * auVar118._0_4_;
            auVar112._4_4_ = auVar136._4_4_ * auVar118._4_4_;
            auVar112._8_4_ = auVar136._8_4_ * auVar118._8_4_;
            auVar112._12_4_ = auVar136._12_4_ * auVar118._12_4_;
            auVar86 = vminps_avx(auVar144,auVar112);
            auVar118 = vmaxps_avx(auVar112,auVar144);
            auVar5 = vmovsldup_avx(auVar20);
            auVar320._0_4_ = auVar107._0_4_ * auVar5._0_4_;
            auVar320._4_4_ = auVar107._4_4_ * auVar5._4_4_;
            auVar320._8_4_ = auVar107._8_4_ * auVar5._8_4_;
            auVar320._12_4_ = auVar107._12_4_ * auVar5._12_4_;
            auVar145._0_4_ = auVar231._0_4_ * auVar5._0_4_;
            auVar145._4_4_ = auVar231._4_4_ * auVar5._4_4_;
            auVar145._8_4_ = auVar231._8_4_ * auVar5._8_4_;
            auVar145._12_4_ = auVar231._12_4_ * auVar5._12_4_;
            auVar5 = vminps_avx(auVar320,auVar145);
            auVar178._0_4_ = auVar86._0_4_ + auVar5._0_4_;
            auVar178._4_4_ = auVar86._4_4_ + auVar5._4_4_;
            auVar178._8_4_ = auVar86._8_4_ + auVar5._8_4_;
            auVar178._12_4_ = auVar86._12_4_ + auVar5._12_4_;
            auVar86 = vmaxps_avx(auVar145,auVar320);
            auVar5 = vsubps_avx(auVar283,auVar161);
            auVar252 = vsubps_avx(auVar291,auVar161);
            auVar113._0_4_ = auVar118._0_4_ + auVar86._0_4_;
            auVar113._4_4_ = auVar118._4_4_ + auVar86._4_4_;
            auVar113._8_4_ = auVar118._8_4_ + auVar86._8_4_;
            auVar113._12_4_ = auVar118._12_4_ + auVar86._12_4_;
            auVar146._8_8_ = 0x3f800000;
            auVar146._0_8_ = 0x3f800000;
            auVar118 = vsubps_avx(auVar146,auVar113);
            auVar86 = vsubps_avx(auVar146,auVar178);
            fVar230 = auVar5._0_4_;
            auVar179._0_4_ = fVar230 * auVar118._0_4_;
            fVar213 = auVar5._4_4_;
            auVar179._4_4_ = fVar213 * auVar118._4_4_;
            fVar232 = auVar5._8_4_;
            auVar179._8_4_ = fVar232 * auVar118._8_4_;
            fVar214 = auVar5._12_4_;
            auVar179._12_4_ = fVar214 * auVar118._12_4_;
            fVar228 = auVar252._0_4_;
            auVar114._0_4_ = fVar228 * auVar118._0_4_;
            fVar211 = auVar252._4_4_;
            auVar114._4_4_ = fVar211 * auVar118._4_4_;
            fVar229 = auVar252._8_4_;
            auVar114._8_4_ = fVar229 * auVar118._8_4_;
            fVar212 = auVar252._12_4_;
            auVar114._12_4_ = fVar212 * auVar118._12_4_;
            auVar292._0_4_ = fVar230 * auVar86._0_4_;
            auVar292._4_4_ = fVar213 * auVar86._4_4_;
            auVar292._8_4_ = fVar232 * auVar86._8_4_;
            auVar292._12_4_ = fVar214 * auVar86._12_4_;
            auVar147._0_4_ = fVar228 * auVar86._0_4_;
            auVar147._4_4_ = fVar211 * auVar86._4_4_;
            auVar147._8_4_ = fVar229 * auVar86._8_4_;
            auVar147._12_4_ = fVar212 * auVar86._12_4_;
            auVar118 = vminps_avx(auVar179,auVar292);
            auVar86 = vminps_avx(auVar114,auVar147);
            auVar5 = vminps_avx(auVar118,auVar86);
            auVar118 = vmaxps_avx(auVar292,auVar179);
            auVar86 = vmaxps_avx(auVar147,auVar114);
            auVar252 = vshufps_avx(auVar161,auVar161,0x54);
            auVar86 = vmaxps_avx(auVar86,auVar118);
            auVar281 = vshufps_avx(auVar301,auVar301,0);
            auVar69 = vshufps_avx(auVar301,auVar301,0x55);
            auVar118 = vhaddps_avx(auVar5,auVar5);
            auVar86 = vhaddps_avx(auVar86,auVar86);
            auVar162._0_4_ = auVar281._0_4_ * auVar77._0_4_ + auVar69._0_4_ * auVar20._0_4_;
            auVar162._4_4_ = auVar281._4_4_ * auVar77._4_4_ + auVar69._4_4_ * auVar20._4_4_;
            auVar162._8_4_ = auVar281._8_4_ * auVar77._8_4_ + auVar69._8_4_ * auVar20._8_4_;
            auVar162._12_4_ = auVar281._12_4_ * auVar77._12_4_ + auVar69._12_4_ * auVar20._12_4_;
            auVar5 = vsubps_avx(auVar252,auVar162);
            fVar227 = auVar5._0_4_ + auVar118._0_4_;
            fVar210 = auVar5._0_4_ + auVar86._0_4_;
            auVar118 = vmaxss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar227));
            auVar86 = vminss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar192));
            if (auVar118._0_4_ <= auVar86._0_4_) {
              auVar118 = vmovshdup_avx(auVar77);
              auVar83._0_4_ = auVar118._0_4_ * auVar106._0_4_;
              auVar83._4_4_ = auVar118._4_4_ * auVar106._4_4_;
              auVar83._8_4_ = auVar118._8_4_ * auVar106._8_4_;
              auVar83._12_4_ = auVar118._12_4_ * auVar106._12_4_;
              auVar115._0_4_ = auVar136._0_4_ * auVar118._0_4_;
              auVar115._4_4_ = auVar136._4_4_ * auVar118._4_4_;
              auVar115._8_4_ = auVar136._8_4_ * auVar118._8_4_;
              auVar115._12_4_ = auVar136._12_4_ * auVar118._12_4_;
              auVar86 = vminps_avx(auVar83,auVar115);
              auVar118 = vmaxps_avx(auVar115,auVar83);
              auVar106 = vmovshdup_avx(auVar20);
              auVar180._0_4_ = auVar107._0_4_ * auVar106._0_4_;
              auVar180._4_4_ = auVar107._4_4_ * auVar106._4_4_;
              auVar180._8_4_ = auVar107._8_4_ * auVar106._8_4_;
              auVar180._12_4_ = auVar107._12_4_ * auVar106._12_4_;
              auVar116._0_4_ = auVar231._0_4_ * auVar106._0_4_;
              auVar116._4_4_ = auVar231._4_4_ * auVar106._4_4_;
              auVar116._8_4_ = auVar231._8_4_ * auVar106._8_4_;
              auVar116._12_4_ = auVar231._12_4_ * auVar106._12_4_;
              auVar106 = vminps_avx(auVar180,auVar116);
              auVar148._0_4_ = auVar86._0_4_ + auVar106._0_4_;
              auVar148._4_4_ = auVar86._4_4_ + auVar106._4_4_;
              auVar148._8_4_ = auVar86._8_4_ + auVar106._8_4_;
              auVar148._12_4_ = auVar86._12_4_ + auVar106._12_4_;
              auVar86 = vmaxps_avx(auVar116,auVar180);
              auVar84._0_4_ = auVar118._0_4_ + auVar86._0_4_;
              auVar84._4_4_ = auVar118._4_4_ + auVar86._4_4_;
              auVar84._8_4_ = auVar118._8_4_ + auVar86._8_4_;
              auVar84._12_4_ = auVar118._12_4_ + auVar86._12_4_;
              auVar118 = vsubps_avx(_local_378,auVar84);
              auVar86 = vsubps_avx(_local_378,auVar148);
              auVar149._0_4_ = fVar230 * auVar118._0_4_;
              auVar149._4_4_ = fVar213 * auVar118._4_4_;
              auVar149._8_4_ = fVar232 * auVar118._8_4_;
              auVar149._12_4_ = fVar214 * auVar118._12_4_;
              auVar181._0_4_ = fVar230 * auVar86._0_4_;
              auVar181._4_4_ = fVar213 * auVar86._4_4_;
              auVar181._8_4_ = fVar232 * auVar86._8_4_;
              auVar181._12_4_ = fVar214 * auVar86._12_4_;
              auVar85._0_4_ = fVar228 * auVar118._0_4_;
              auVar85._4_4_ = fVar211 * auVar118._4_4_;
              auVar85._8_4_ = fVar229 * auVar118._8_4_;
              auVar85._12_4_ = fVar212 * auVar118._12_4_;
              auVar117._0_4_ = fVar228 * auVar86._0_4_;
              auVar117._4_4_ = fVar211 * auVar86._4_4_;
              auVar117._8_4_ = fVar229 * auVar86._8_4_;
              auVar117._12_4_ = fVar212 * auVar86._12_4_;
              auVar118 = vminps_avx(auVar149,auVar181);
              auVar86 = vminps_avx(auVar85,auVar117);
              auVar118 = vminps_avx(auVar118,auVar86);
              auVar86 = vmaxps_avx(auVar181,auVar149);
              auVar106 = vmaxps_avx(auVar117,auVar85);
              auVar118 = vhaddps_avx(auVar118,auVar118);
              auVar86 = vmaxps_avx(auVar106,auVar86);
              auVar86 = vhaddps_avx(auVar86,auVar86);
              auVar106 = vmovshdup_avx(auVar5);
              auVar136 = ZEXT416((uint)(auVar106._0_4_ + auVar118._0_4_));
              auVar118 = vmaxss_avx(auVar325,auVar136);
              auVar106 = ZEXT416((uint)(auVar106._0_4_ + auVar86._0_4_));
              auVar86 = vminss_avx(auVar106,_local_428);
              if (auVar118._0_4_ <= auVar86._0_4_) {
                bVar63 = 0;
                if ((fVar209 < fVar227) && (fVar210 < fVar192)) {
                  auVar118 = vcmpps_avx(auVar106,_local_428,1);
                  auVar86 = vcmpps_avx(auVar325,auVar136,1);
                  auVar118 = vandps_avx(auVar86,auVar118);
                  bVar63 = auVar118[0];
                }
                auVar315 = ZEXT1664(auVar325);
                if ((uVar68 < 4 && 0.001 <= fVar215) && (bVar63 & 1) == 0) goto LAB_0103304d;
                lVar65 = 200;
                do {
                  fVar215 = auVar5._0_4_;
                  fVar192 = 1.0 - fVar215;
                  auVar150 = ZEXT416((uint)(fVar192 * fVar192 * fVar192));
                  auVar150 = vshufps_avx(auVar150,auVar150,0);
                  auVar118 = ZEXT416((uint)(fVar215 * 3.0 * fVar192 * fVar192));
                  auVar118 = vshufps_avx(auVar118,auVar118,0);
                  auVar86 = ZEXT416((uint)(fVar192 * fVar215 * fVar215 * 3.0));
                  auVar86 = vshufps_avx(auVar86,auVar86,0);
                  auVar106 = ZEXT416((uint)(fVar215 * fVar215 * fVar215));
                  auVar106 = vshufps_avx(auVar106,auVar106,0);
                  fVar192 = auVar150._0_4_ * (float)local_4a8._0_4_ +
                            auVar118._0_4_ * (float)local_4b8._0_4_ +
                            auVar106._0_4_ * (float)local_1e8._0_4_ +
                            auVar86._0_4_ * (float)local_4c8._0_4_;
                  fVar215 = auVar150._4_4_ * (float)local_4a8._4_4_ +
                            auVar118._4_4_ * (float)local_4b8._4_4_ +
                            auVar106._4_4_ * (float)local_1e8._4_4_ +
                            auVar86._4_4_ * (float)local_4c8._4_4_;
                  auVar87._0_8_ = CONCAT44(fVar215,fVar192);
                  auVar87._8_4_ =
                       auVar150._8_4_ * fStack_4a0 +
                       auVar118._8_4_ * fStack_4b0 +
                       auVar106._8_4_ * fStack_1e0 + auVar86._8_4_ * fStack_4c0;
                  auVar87._12_4_ =
                       auVar150._12_4_ * fStack_49c +
                       auVar118._12_4_ * fStack_4ac +
                       auVar106._12_4_ * fStack_1dc + auVar86._12_4_ * fStack_4bc;
                  auVar119._8_8_ = auVar87._0_8_;
                  auVar119._0_8_ = auVar87._0_8_;
                  auVar118 = vshufpd_avx(auVar87,auVar87,1);
                  auVar150 = vmovshdup_avx(auVar5);
                  auVar118 = vsubps_avx(auVar118,auVar119);
                  auVar88._0_4_ = auVar150._0_4_ * auVar118._0_4_ + fVar192;
                  auVar88._4_4_ = auVar150._4_4_ * auVar118._4_4_ + fVar215;
                  auVar88._8_4_ = auVar150._8_4_ * auVar118._8_4_ + fVar192;
                  auVar88._12_4_ = auVar150._12_4_ * auVar118._12_4_ + fVar215;
                  auVar150 = vshufps_avx(auVar88,auVar88,0);
                  auVar118 = vshufps_avx(auVar88,auVar88,0x55);
                  auVar120._0_4_ = auVar77._0_4_ * auVar150._0_4_ + auVar20._0_4_ * auVar118._0_4_;
                  auVar120._4_4_ = auVar77._4_4_ * auVar150._4_4_ + auVar20._4_4_ * auVar118._4_4_;
                  auVar120._8_4_ = auVar77._8_4_ * auVar150._8_4_ + auVar20._8_4_ * auVar118._8_4_;
                  auVar120._12_4_ =
                       auVar77._12_4_ * auVar150._12_4_ + auVar20._12_4_ * auVar118._12_4_;
                  auVar5 = vsubps_avx(auVar5,auVar120);
                  auVar121._8_4_ = 0x7fffffff;
                  auVar121._0_8_ = 0x7fffffff7fffffff;
                  auVar121._12_4_ = 0x7fffffff;
                  auVar150 = vandps_avx(auVar88,auVar121);
                  auVar118 = vshufps_avx(auVar150,auVar150,0xf5);
                  auVar150 = vmaxss_avx(auVar118,auVar150);
                  if (auVar150._0_4_ < (float)local_1f8._0_4_) {
                    fVar192 = auVar5._0_4_;
                    if ((fVar192 < 0.0) || (1.0 < fVar192)) break;
                    auVar150 = vmovshdup_avx(auVar5);
                    fVar215 = auVar150._0_4_;
                    if ((fVar215 < 0.0) || (1.0 < fVar215)) break;
                    auVar150 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                             ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c
                                            );
                    auVar107 = vinsertps_avx(auVar150,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                    [2]),0x28);
                    aVar4 = (ray->super_RayK<1>).org.field_0;
                    auVar150 = vsubps_avx(_local_3a8,(undefined1  [16])aVar4);
                    auVar150 = vdpps_avx(auVar150,auVar107,0x7f);
                    auVar77 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
                    auVar77 = vdpps_avx(auVar77,auVar107,0x7f);
                    auVar20 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
                    auVar20 = vdpps_avx(auVar20,auVar107,0x7f);
                    auVar118 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
                    auVar118 = vdpps_avx(auVar118,auVar107,0x7f);
                    auVar86 = vsubps_avx(_local_3b8,(undefined1  [16])aVar4);
                    auVar86 = vdpps_avx(auVar86,auVar107,0x7f);
                    auVar106 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
                    auVar106 = vdpps_avx(auVar106,auVar107,0x7f);
                    auVar136 = vsubps_avx(_local_2e8,(undefined1  [16])aVar4);
                    auVar136 = vdpps_avx(auVar136,auVar107,0x7f);
                    auVar231 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
                    auVar107 = vdpps_avx(auVar231,auVar107,0x7f);
                    fVar211 = 1.0 - fVar215;
                    fVar229 = 1.0 - fVar192;
                    fVar209 = auVar5._4_4_;
                    fVar227 = auVar5._8_4_;
                    fVar210 = auVar5._12_4_;
                    fVar228 = fVar229 * fVar192 * fVar192 * 3.0;
                    auVar203._0_4_ = fVar192 * fVar192 * fVar192;
                    auVar203._4_4_ = fVar209 * fVar209 * fVar209;
                    auVar203._8_4_ = fVar227 * fVar227 * fVar227;
                    auVar203._12_4_ = fVar210 * fVar210 * fVar210;
                    fVar209 = fVar192 * 3.0 * fVar229 * fVar229;
                    fVar227 = fVar229 * fVar229 * fVar229;
                    fVar192 = (fVar211 * auVar150._0_4_ + auVar86._0_4_ * fVar215) * fVar227 +
                              fVar209 * (auVar106._0_4_ * fVar215 + fVar211 * auVar77._0_4_) +
                              fVar228 * (auVar136._0_4_ * fVar215 + fVar211 * auVar20._0_4_) +
                              auVar203._0_4_ * (fVar211 * auVar118._0_4_ + fVar215 * auVar107._0_4_)
                    ;
                    if (((fVar192 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
                        (fVar215 = (ray->super_RayK<1>).tfar, fVar215 < fVar192)) ||
                       (pGVar7 = (context->scene->geometries).items[uVar61].ptr,
                       (pGVar7->mask & (ray->super_RayK<1>).mask) == 0)) break;
                    auVar150 = vshufps_avx(auVar5,auVar5,0x55);
                    auVar256._8_4_ = 0x3f800000;
                    auVar256._0_8_ = 0x3f8000003f800000;
                    auVar256._12_4_ = 0x3f800000;
                    auVar77 = vsubps_avx(auVar256,auVar150);
                    fVar210 = auVar150._0_4_;
                    fVar211 = auVar150._4_4_;
                    fVar212 = auVar150._8_4_;
                    fVar230 = auVar150._12_4_;
                    fVar213 = auVar77._0_4_;
                    fVar232 = auVar77._4_4_;
                    fVar214 = auVar77._8_4_;
                    fVar233 = auVar77._12_4_;
                    auVar266._0_4_ =
                         fVar210 * (float)local_3b8._0_4_ + fVar213 * (float)local_3a8._0_4_;
                    auVar266._4_4_ =
                         fVar211 * (float)local_3b8._4_4_ + fVar232 * (float)local_3a8._4_4_;
                    auVar266._8_4_ = fVar212 * fStack_3b0 + fVar214 * fStack_3a0;
                    auVar266._12_4_ = fVar230 * fStack_3ac + fVar233 * fStack_39c;
                    auVar284._0_4_ =
                         fVar210 * (float)local_408._0_4_ + fVar213 * (float)local_3e8._0_4_;
                    auVar284._4_4_ =
                         fVar211 * (float)local_408._4_4_ + fVar232 * (float)local_3e8._4_4_;
                    auVar284._8_4_ = fVar212 * fStack_400 + fVar214 * fStack_3e0;
                    auVar284._12_4_ = fVar230 * fStack_3fc + fVar233 * fStack_3dc;
                    auVar293._0_4_ =
                         fVar210 * (float)local_2e8._0_4_ + fVar213 * (float)local_3f8._0_4_;
                    auVar293._4_4_ =
                         fVar211 * (float)local_2e8._4_4_ + fVar232 * (float)local_3f8._4_4_;
                    auVar293._8_4_ = fVar212 * fStack_2e0 + fVar214 * fStack_3f0;
                    auVar293._12_4_ = fVar230 * fStack_2dc + fVar233 * fStack_3ec;
                    auVar239._0_4_ =
                         fVar213 * (float)local_3c8._0_4_ + fVar210 * (float)local_3d8._0_4_;
                    auVar239._4_4_ =
                         fVar232 * (float)local_3c8._4_4_ + fVar211 * (float)local_3d8._4_4_;
                    auVar239._8_4_ = fVar214 * fStack_3c0 + fVar212 * fStack_3d0;
                    auVar239._12_4_ = fVar233 * fStack_3bc + fVar230 * fStack_3cc;
                    auVar118 = vsubps_avx(auVar284,auVar266);
                    auVar86 = vsubps_avx(auVar293,auVar284);
                    auVar106 = vsubps_avx(auVar239,auVar293);
                    auVar150 = vshufps_avx(auVar5,auVar5,0);
                    fVar230 = auVar150._0_4_;
                    fVar213 = auVar150._4_4_;
                    fVar232 = auVar150._8_4_;
                    fVar214 = auVar150._12_4_;
                    auVar150 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                    fVar210 = auVar150._0_4_;
                    fVar211 = auVar150._4_4_;
                    fVar229 = auVar150._8_4_;
                    fVar212 = auVar150._12_4_;
                    auVar150 = vshufps_avx(auVar203,auVar203,0);
                    auVar77 = vshufps_avx(ZEXT416((uint)fVar228),ZEXT416((uint)fVar228),0);
                    auVar20 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
                    auVar182._0_4_ =
                         ((auVar118._0_4_ * fVar210 + fVar230 * auVar86._0_4_) * fVar210 +
                         fVar230 * (auVar86._0_4_ * fVar210 + fVar230 * auVar106._0_4_)) * 3.0;
                    auVar182._4_4_ =
                         ((auVar118._4_4_ * fVar211 + fVar213 * auVar86._4_4_) * fVar211 +
                         fVar213 * (auVar86._4_4_ * fVar211 + fVar213 * auVar106._4_4_)) * 3.0;
                    auVar182._8_4_ =
                         ((auVar118._8_4_ * fVar229 + fVar232 * auVar86._8_4_) * fVar229 +
                         fVar232 * (auVar86._8_4_ * fVar229 + fVar232 * auVar106._8_4_)) * 3.0;
                    auVar182._12_4_ =
                         ((auVar118._12_4_ * fVar212 + fVar214 * auVar86._12_4_) * fVar212 +
                         fVar214 * (auVar86._12_4_ * fVar212 + fVar214 * auVar106._12_4_)) * 3.0;
                    auVar118 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
                    auVar122._0_4_ =
                         auVar118._0_4_ * (float)local_248._0_4_ +
                         auVar20._0_4_ * (float)local_258._0_4_ +
                         auVar150._0_4_ * (float)local_278._0_4_ +
                         auVar77._0_4_ * (float)local_268._0_4_;
                    auVar122._4_4_ =
                         auVar118._4_4_ * (float)local_248._4_4_ +
                         auVar20._4_4_ * (float)local_258._4_4_ +
                         auVar150._4_4_ * (float)local_278._4_4_ +
                         auVar77._4_4_ * (float)local_268._4_4_;
                    auVar122._8_4_ =
                         auVar118._8_4_ * fStack_240 +
                         auVar20._8_4_ * fStack_250 +
                         auVar150._8_4_ * fStack_270 + auVar77._8_4_ * fStack_260;
                    auVar122._12_4_ =
                         auVar118._12_4_ * fStack_23c +
                         auVar20._12_4_ * fStack_24c +
                         auVar150._12_4_ * fStack_26c + auVar77._12_4_ * fStack_25c;
                    auVar150 = vshufps_avx(auVar182,auVar182,0xc9);
                    auVar151._0_4_ = auVar122._0_4_ * auVar150._0_4_;
                    auVar151._4_4_ = auVar122._4_4_ * auVar150._4_4_;
                    auVar151._8_4_ = auVar122._8_4_ * auVar150._8_4_;
                    auVar151._12_4_ = auVar122._12_4_ * auVar150._12_4_;
                    auVar150 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar123._0_4_ = auVar182._0_4_ * auVar150._0_4_;
                    auVar123._4_4_ = auVar182._4_4_ * auVar150._4_4_;
                    auVar123._8_4_ = auVar182._8_4_ * auVar150._8_4_;
                    auVar123._12_4_ = auVar182._12_4_ * auVar150._12_4_;
                    auVar150 = vsubps_avx(auVar123,auVar151);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar192;
                      auVar77 = vshufps_avx(auVar150,auVar150,0xe9);
                      uVar3 = vmovlps_avx(auVar77);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                      (ray->Ng).field_0.field_0.z = auVar150._0_4_;
                      uVar3 = vmovlps_avx(auVar5);
                      ray->u = (float)(int)uVar3;
                      ray->v = (float)(int)((ulong)uVar3 >> 0x20);
                      ray->primID = (uint)local_430;
                      ray->geomID = uVar61;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                      break;
                    }
                    auVar77 = vshufps_avx(auVar150,auVar150,0xe9);
                    local_2a8 = vmovlps_avx(auVar77);
                    local_2a0 = auVar150._0_4_;
                    local_29c = vmovlps_avx(auVar5);
                    local_294 = (uint)local_430;
                    local_290 = uVar61;
                    local_28c = context->user->instID[0];
                    local_288 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar192;
                    local_4cc = -1;
                    local_338.valid = &local_4cc;
                    local_338.geometryUserPtr = pGVar7->userPtr;
                    local_338.context = context->user;
                    local_338.ray = (RTCRayN *)ray;
                    local_338.hit = (RTCHitN *)&local_2a8;
                    local_338.N = 1;
                    if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar7->intersectionFilterN)(&local_338), *local_338.valid != 0)) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 == (RTCFilterFunctionN)0x0) ||
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT &&
                           (((pGVar7->field_8).field_0x2 & 0x40) == 0)) ||
                          ((*p_Var8)(&local_338), *local_338.valid != 0)))) {
                        (((Vec3f *)((long)local_338.ray + 0x30))->field_0).components[0] =
                             *(float *)local_338.hit;
                        (((Vec3f *)((long)local_338.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_338.hit + 4);
                        (((Vec3f *)((long)local_338.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_338.hit + 8);
                        *(float *)((long)local_338.ray + 0x3c) = *(float *)(local_338.hit + 0xc);
                        *(float *)((long)local_338.ray + 0x40) = *(float *)(local_338.hit + 0x10);
                        *(float *)((long)local_338.ray + 0x44) = *(float *)(local_338.hit + 0x14);
                        *(float *)((long)local_338.ray + 0x48) = *(float *)(local_338.hit + 0x18);
                        *(float *)((long)local_338.ray + 0x4c) = *(float *)(local_338.hit + 0x1c);
                        *(float *)((long)local_338.ray + 0x50) = *(float *)(local_338.hit + 0x20);
                        break;
                      }
                    }
                    (ray->super_RayK<1>).tfar = fVar215;
                    break;
                  }
                  lVar65 = lVar65 + -1;
                } while (lVar65 != 0);
              }
            }
          }
        }
        if (uVar68 == 0) break;
      } while( true );
    }
    fVar192 = (ray->super_RayK<1>).tfar;
    auVar98._4_4_ = fVar192;
    auVar98._0_4_ = fVar192;
    auVar98._8_4_ = fVar192;
    auVar98._12_4_ = fVar192;
    auVar98._16_4_ = fVar192;
    auVar98._20_4_ = fVar192;
    auVar98._24_4_ = fVar192;
    auVar98._28_4_ = fVar192;
    auVar89 = vcmpps_avx(local_198,auVar98,2);
    uVar61 = vmovmskps_avx(auVar89);
    uVar61 = (uint)uVar67 & uVar61;
    if (uVar61 == 0) {
      return;
    }
  } while( true );
LAB_0103304d:
  auVar150 = vinsertps_avx(ZEXT416((uint)fVar209),auVar150,0x10);
  auVar297 = ZEXT1664(auVar150);
  auVar226 = ZEXT1664(local_388);
  auVar247 = ZEXT1664(local_448);
  auVar258 = ZEXT1664(local_458);
  auVar270 = ZEXT1664(local_468);
  auVar208 = ZEXT1664(_local_398);
  auVar288 = ZEXT1664(local_478);
  auVar326 = ZEXT1664(local_488);
  auVar303 = ZEXT1664(local_498);
  goto LAB_010319cb;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }